

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::sse2::CurveNvIntersectorK<4,4>::
     intersect_t<embree::sse2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::sse2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive *pPVar1;
  Primitive *pPVar2;
  Primitive *pPVar3;
  Primitive *pPVar4;
  Primitive PVar5;
  undefined4 uVar6;
  Geometry *pGVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  RTCFeatureFlags RVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined6 uVar36;
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  int iVar52;
  undefined4 uVar53;
  long lVar54;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong uVar55;
  ulong uVar56;
  undefined4 uVar61;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  RTCFilterFunctionN p_Var57;
  RTCIntersectArguments *pRVar58;
  RayHitK<4> *pRVar59;
  ulong uVar60;
  RTCIntersectArguments *pRVar62;
  ulong uVar63;
  ulong uVar64;
  bool bVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  short sVar71;
  float fVar72;
  float fVar118;
  float fVar120;
  __m128 a_1;
  float fVar73;
  undefined2 uVar117;
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  float fVar119;
  float fVar121;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar122;
  float fVar146;
  float fVar147;
  vfloat4 a;
  undefined1 auVar123 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar148;
  float fVar161;
  float fVar162;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar163;
  float fVar174;
  float fVar175;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar176;
  float fVar188;
  float fVar189;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar190;
  float fVar200;
  float fVar201;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar202;
  float fVar212;
  float fVar213;
  undefined1 auVar203 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar214;
  float fVar234;
  float fVar235;
  undefined1 auVar215 [16];
  undefined1 auVar218 [16];
  undefined1 auVar221 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar236;
  float fVar244;
  float fVar245;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar246;
  float fVar257;
  float fVar258;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar253 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar259;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  float fVar267;
  float fVar268;
  float fVar273;
  float fVar274;
  undefined1 auVar269 [16];
  float fVar275;
  undefined1 auVar272 [16];
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx u_outer1;
  vfloatx u_outer0;
  vboolx valid;
  BBox<embree::vfloat_impl<4>_> tp1;
  BBox<embree::vfloat_impl<4>_> tp0;
  StackEntry stack [4];
  undefined1 local_668 [8];
  float fStack_660;
  float fStack_65c;
  undefined1 local_638 [8];
  float fStack_630;
  float fStack_62c;
  undefined8 local_5f8;
  undefined8 local_578;
  undefined8 uStack_570;
  ulong local_560;
  undefined1 local_558 [4];
  float fStack_554;
  undefined8 uStack_550;
  RTCRayQueryContext *local_548;
  RayHitK<4> *local_540;
  RTCIntersectArguments *local_538;
  uint local_530;
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  float local_4a8;
  float fStack_4a4;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  undefined4 uStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined8 *local_418;
  Primitive *local_410;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [16];
  float local_378 [4];
  float local_368 [4];
  Primitive *local_358;
  ulong local_350;
  undefined4 local_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  uint local_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [12];
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  uint local_268;
  uint uStack_264;
  uint uStack_260;
  uint uStack_25c;
  uint local_258;
  uint uStack_254;
  uint uStack_250;
  uint uStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  uint auStack_f8 [4];
  float afStack_e8 [6];
  float afStack_d0 [40];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 uVar116;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar155 [16];
  undefined1 auVar158 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar252 [16];
  undefined1 auVar254 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  
  PVar5 = prim[1];
  uVar56 = (ulong)(byte)PVar5;
  pPVar1 = prim + uVar56 * 0x19 + 6;
  fVar162 = *(float *)(pPVar1 + 0xc);
  fVar176 = (*(float *)(ray + k * 4) - *(float *)pPVar1) * fVar162;
  fVar188 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar1 + 4)) * fVar162;
  fVar189 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar1 + 8)) * fVar162;
  fVar148 = *(float *)(ray + k * 4 + 0x40) * fVar162;
  fVar161 = *(float *)(ray + k * 4 + 0x50) * fVar162;
  fVar162 = *(float *)(ray + k * 4 + 0x60) * fVar162;
  uVar6 = *(undefined4 *)(prim + uVar56 * 4 + 6);
  uVar116 = (undefined1)((uint)uVar6 >> 0x18);
  uVar117 = CONCAT11(uVar116,uVar116);
  uVar116 = (undefined1)((uint)uVar6 >> 0x10);
  uVar16 = CONCAT35(CONCAT21(uVar117,uVar116),CONCAT14(uVar116,uVar6));
  uVar116 = (undefined1)((uint)uVar6 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar16 >> 0x20),uVar116),uVar116);
  sVar71 = CONCAT11((char)uVar6,(char)uVar6);
  uVar63 = CONCAT62(uVar36,sVar71);
  auVar231._8_4_ = 0;
  auVar231._0_8_ = uVar63;
  auVar231._12_2_ = uVar117;
  auVar231._14_2_ = uVar117;
  uVar117 = (undefined2)((ulong)uVar16 >> 0x20);
  auVar194._12_4_ = auVar231._12_4_;
  auVar194._8_2_ = 0;
  auVar194._0_8_ = uVar63;
  auVar194._10_2_ = uVar117;
  auVar193._10_6_ = auVar194._10_6_;
  auVar193._8_2_ = uVar117;
  auVar193._0_8_ = uVar63;
  uVar117 = (undefined2)uVar36;
  auVar37._4_8_ = auVar193._8_8_;
  auVar37._2_2_ = uVar117;
  auVar37._0_2_ = uVar117;
  fVar122 = (float)((int)sVar71 >> 8);
  fVar146 = (float)(auVar37._0_4_ >> 0x18);
  fVar147 = (float)(auVar193._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar56 * 5 + 6);
  uVar116 = (undefined1)((uint)uVar6 >> 0x18);
  uVar117 = CONCAT11(uVar116,uVar116);
  uVar116 = (undefined1)((uint)uVar6 >> 0x10);
  uVar16 = CONCAT35(CONCAT21(uVar117,uVar116),CONCAT14(uVar116,uVar6));
  uVar116 = (undefined1)((uint)uVar6 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar16 >> 0x20),uVar116),uVar116);
  sVar71 = CONCAT11((char)uVar6,(char)uVar6);
  uVar63 = CONCAT62(uVar36,sVar71);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar63;
  auVar76._12_2_ = uVar117;
  auVar76._14_2_ = uVar117;
  uVar117 = (undefined2)((ulong)uVar16 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar63;
  auVar75._10_2_ = uVar117;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar117;
  auVar74._0_8_ = uVar63;
  uVar117 = (undefined2)uVar36;
  auVar38._4_8_ = auVar74._8_8_;
  auVar38._2_2_ = uVar117;
  auVar38._0_2_ = uVar117;
  fVar190 = (float)((int)sVar71 >> 8);
  fVar200 = (float)(auVar38._0_4_ >> 0x18);
  fVar201 = (float)(auVar74._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar56 * 6 + 6);
  uVar116 = (undefined1)((uint)uVar6 >> 0x18);
  uVar117 = CONCAT11(uVar116,uVar116);
  uVar116 = (undefined1)((uint)uVar6 >> 0x10);
  uVar16 = CONCAT35(CONCAT21(uVar117,uVar116),CONCAT14(uVar116,uVar6));
  uVar116 = (undefined1)((uint)uVar6 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar16 >> 0x20),uVar116),uVar116);
  sVar71 = CONCAT11((char)uVar6,(char)uVar6);
  uVar63 = CONCAT62(uVar36,sVar71);
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar63;
  auVar79._12_2_ = uVar117;
  auVar79._14_2_ = uVar117;
  uVar117 = (undefined2)((ulong)uVar16 >> 0x20);
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._8_2_ = 0;
  auVar78._0_8_ = uVar63;
  auVar78._10_2_ = uVar117;
  auVar77._10_6_ = auVar78._10_6_;
  auVar77._8_2_ = uVar117;
  auVar77._0_8_ = uVar63;
  uVar117 = (undefined2)uVar36;
  auVar39._4_8_ = auVar77._8_8_;
  auVar39._2_2_ = uVar117;
  auVar39._0_2_ = uVar117;
  fVar163 = (float)((int)sVar71 >> 8);
  fVar174 = (float)(auVar39._0_4_ >> 0x18);
  fVar175 = (float)(auVar77._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar56 * 0xb + 6);
  uVar116 = (undefined1)((uint)uVar6 >> 0x18);
  uVar117 = CONCAT11(uVar116,uVar116);
  uVar116 = (undefined1)((uint)uVar6 >> 0x10);
  uVar16 = CONCAT35(CONCAT21(uVar117,uVar116),CONCAT14(uVar116,uVar6));
  uVar116 = (undefined1)((uint)uVar6 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar16 >> 0x20),uVar116),uVar116);
  sVar71 = CONCAT11((char)uVar6,(char)uVar6);
  uVar63 = CONCAT62(uVar36,sVar71);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar63;
  auVar82._12_2_ = uVar117;
  auVar82._14_2_ = uVar117;
  uVar117 = (undefined2)((ulong)uVar16 >> 0x20);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar63;
  auVar81._10_2_ = uVar117;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._8_2_ = uVar117;
  auVar80._0_8_ = uVar63;
  uVar117 = (undefined2)uVar36;
  auVar40._4_8_ = auVar80._8_8_;
  auVar40._2_2_ = uVar117;
  auVar40._0_2_ = uVar117;
  fVar72 = (float)((int)sVar71 >> 8);
  fVar118 = (float)(auVar40._0_4_ >> 0x18);
  fVar120 = (float)(auVar80._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  uVar116 = (undefined1)((uint)uVar6 >> 0x18);
  uVar117 = CONCAT11(uVar116,uVar116);
  uVar116 = (undefined1)((uint)uVar6 >> 0x10);
  uVar16 = CONCAT35(CONCAT21(uVar117,uVar116),CONCAT14(uVar116,uVar6));
  uVar116 = (undefined1)((uint)uVar6 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar16 >> 0x20),uVar116),uVar116);
  sVar71 = CONCAT11((char)uVar6,(char)uVar6);
  uVar63 = CONCAT62(uVar36,sVar71);
  auVar205._8_4_ = 0;
  auVar205._0_8_ = uVar63;
  auVar205._12_2_ = uVar117;
  auVar205._14_2_ = uVar117;
  uVar117 = (undefined2)((ulong)uVar16 >> 0x20);
  auVar204._12_4_ = auVar205._12_4_;
  auVar204._8_2_ = 0;
  auVar204._0_8_ = uVar63;
  auVar204._10_2_ = uVar117;
  auVar203._10_6_ = auVar204._10_6_;
  auVar203._8_2_ = uVar117;
  auVar203._0_8_ = uVar63;
  uVar117 = (undefined2)uVar36;
  auVar41._4_8_ = auVar203._8_8_;
  auVar41._2_2_ = uVar117;
  auVar41._0_2_ = uVar117;
  fVar202 = (float)((int)sVar71 >> 8);
  fVar212 = (float)(auVar41._0_4_ >> 0x18);
  fVar213 = (float)(auVar203._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + (uint)(byte)PVar5 * 0xc + uVar56 + 6);
  uVar116 = (undefined1)((uint)uVar6 >> 0x18);
  uVar117 = CONCAT11(uVar116,uVar116);
  uVar116 = (undefined1)((uint)uVar6 >> 0x10);
  uVar16 = CONCAT35(CONCAT21(uVar117,uVar116),CONCAT14(uVar116,uVar6));
  uVar116 = (undefined1)((uint)uVar6 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar16 >> 0x20),uVar116),uVar116);
  sVar71 = CONCAT11((char)uVar6,(char)uVar6);
  uVar63 = CONCAT62(uVar36,sVar71);
  auVar217._8_4_ = 0;
  auVar217._0_8_ = uVar63;
  auVar217._12_2_ = uVar117;
  auVar217._14_2_ = uVar117;
  uVar117 = (undefined2)((ulong)uVar16 >> 0x20);
  auVar216._12_4_ = auVar217._12_4_;
  auVar216._8_2_ = 0;
  auVar216._0_8_ = uVar63;
  auVar216._10_2_ = uVar117;
  auVar215._10_6_ = auVar216._10_6_;
  auVar215._8_2_ = uVar117;
  auVar215._0_8_ = uVar63;
  uVar117 = (undefined2)uVar36;
  auVar42._4_8_ = auVar215._8_8_;
  auVar42._2_2_ = uVar117;
  auVar42._0_2_ = uVar117;
  fVar246 = (float)((int)sVar71 >> 8);
  fVar257 = (float)(auVar42._0_4_ >> 0x18);
  fVar258 = (float)(auVar215._8_4_ >> 0x18);
  uVar64 = (ulong)(uint)((int)(uVar56 * 9) * 2);
  uVar6 = *(undefined4 *)(prim + uVar64 + 6);
  uVar116 = (undefined1)((uint)uVar6 >> 0x18);
  uVar117 = CONCAT11(uVar116,uVar116);
  uVar116 = (undefined1)((uint)uVar6 >> 0x10);
  uVar16 = CONCAT35(CONCAT21(uVar117,uVar116),CONCAT14(uVar116,uVar6));
  uVar116 = (undefined1)((uint)uVar6 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar16 >> 0x20),uVar116),uVar116);
  sVar71 = CONCAT11((char)uVar6,(char)uVar6);
  uVar63 = CONCAT62(uVar36,sVar71);
  auVar220._8_4_ = 0;
  auVar220._0_8_ = uVar63;
  auVar220._12_2_ = uVar117;
  auVar220._14_2_ = uVar117;
  uVar117 = (undefined2)((ulong)uVar16 >> 0x20);
  auVar219._12_4_ = auVar220._12_4_;
  auVar219._8_2_ = 0;
  auVar219._0_8_ = uVar63;
  auVar219._10_2_ = uVar117;
  auVar218._10_6_ = auVar219._10_6_;
  auVar218._8_2_ = uVar117;
  auVar218._0_8_ = uVar63;
  uVar117 = (undefined2)uVar36;
  auVar43._4_8_ = auVar218._8_8_;
  auVar43._2_2_ = uVar117;
  auVar43._0_2_ = uVar117;
  fVar236 = (float)((int)sVar71 >> 8);
  fVar244 = (float)(auVar43._0_4_ >> 0x18);
  fVar245 = (float)(auVar218._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar64 + uVar56 + 6);
  uVar116 = (undefined1)((uint)uVar6 >> 0x18);
  uVar117 = CONCAT11(uVar116,uVar116);
  uVar116 = (undefined1)((uint)uVar6 >> 0x10);
  uVar16 = CONCAT35(CONCAT21(uVar117,uVar116),CONCAT14(uVar116,uVar6));
  uVar116 = (undefined1)((uint)uVar6 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar16 >> 0x20),uVar116),uVar116);
  sVar71 = CONCAT11((char)uVar6,(char)uVar6);
  uVar63 = CONCAT62(uVar36,sVar71);
  auVar223._8_4_ = 0;
  auVar223._0_8_ = uVar63;
  auVar223._12_2_ = uVar117;
  auVar223._14_2_ = uVar117;
  uVar117 = (undefined2)((ulong)uVar16 >> 0x20);
  auVar222._12_4_ = auVar223._12_4_;
  auVar222._8_2_ = 0;
  auVar222._0_8_ = uVar63;
  auVar222._10_2_ = uVar117;
  auVar221._10_6_ = auVar222._10_6_;
  auVar221._8_2_ = uVar117;
  auVar221._0_8_ = uVar63;
  uVar117 = (undefined2)uVar36;
  auVar44._4_8_ = auVar221._8_8_;
  auVar44._2_2_ = uVar117;
  auVar44._0_2_ = uVar117;
  fVar259 = (float)((int)sVar71 >> 8);
  fVar262 = (float)(auVar44._0_4_ >> 0x18);
  fVar264 = (float)(auVar221._8_4_ >> 0x18);
  uVar60 = (ulong)(uint)((int)(uVar56 * 5) << 2);
  uVar6 = *(undefined4 *)(prim + uVar60 + 6);
  uVar116 = (undefined1)((uint)uVar6 >> 0x18);
  uVar117 = CONCAT11(uVar116,uVar116);
  uVar116 = (undefined1)((uint)uVar6 >> 0x10);
  uVar16 = CONCAT35(CONCAT21(uVar117,uVar116),CONCAT14(uVar116,uVar6));
  uVar116 = (undefined1)((uint)uVar6 >> 8);
  uVar36 = CONCAT51(CONCAT41((int)((ulong)uVar16 >> 0x20),uVar116),uVar116);
  sVar71 = CONCAT11((char)uVar6,(char)uVar6);
  uVar63 = CONCAT62(uVar36,sVar71);
  auVar271._8_4_ = 0;
  auVar271._0_8_ = uVar63;
  auVar271._12_2_ = uVar117;
  auVar271._14_2_ = uVar117;
  uVar117 = (undefined2)((ulong)uVar16 >> 0x20);
  auVar270._12_4_ = auVar271._12_4_;
  auVar270._8_2_ = 0;
  auVar270._0_8_ = uVar63;
  auVar270._10_2_ = uVar117;
  auVar269._10_6_ = auVar270._10_6_;
  auVar269._8_2_ = uVar117;
  auVar269._0_8_ = uVar63;
  uVar117 = (undefined2)uVar36;
  auVar45._4_8_ = auVar269._8_8_;
  auVar45._2_2_ = uVar117;
  auVar45._0_2_ = uVar117;
  fVar73 = (float)((int)sVar71 >> 8);
  fVar119 = (float)(auVar45._0_4_ >> 0x18);
  fVar121 = (float)(auVar269._8_4_ >> 0x18);
  fVar276 = fVar148 * fVar122 + fVar161 * fVar190 + fVar162 * fVar163;
  fVar277 = fVar148 * fVar146 + fVar161 * fVar200 + fVar162 * fVar174;
  fVar278 = fVar148 * fVar147 + fVar161 * fVar201 + fVar162 * fVar175;
  fVar279 = fVar148 * (float)(auVar194._12_4_ >> 0x18) +
            fVar161 * (float)(auVar75._12_4_ >> 0x18) + fVar162 * (float)(auVar78._12_4_ >> 0x18);
  fVar267 = fVar148 * fVar72 + fVar161 * fVar202 + fVar162 * fVar246;
  fVar273 = fVar148 * fVar118 + fVar161 * fVar212 + fVar162 * fVar257;
  fVar274 = fVar148 * fVar120 + fVar161 * fVar213 + fVar162 * fVar258;
  fVar275 = fVar148 * (float)(auVar81._12_4_ >> 0x18) +
            fVar161 * (float)(auVar204._12_4_ >> 0x18) + fVar162 * (float)(auVar216._12_4_ >> 0x18);
  fVar214 = fVar148 * fVar236 + fVar161 * fVar259 + fVar162 * fVar73;
  fVar234 = fVar148 * fVar244 + fVar161 * fVar262 + fVar162 * fVar119;
  fVar235 = fVar148 * fVar245 + fVar161 * fVar264 + fVar162 * fVar121;
  fVar148 = fVar148 * (float)(auVar219._12_4_ >> 0x18) +
            fVar161 * (float)(auVar222._12_4_ >> 0x18) + fVar162 * (float)(auVar270._12_4_ >> 0x18);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar163 = fVar122 * fVar176 + fVar190 * fVar188 + fVar163 * fVar189;
  fVar174 = fVar146 * fVar176 + fVar200 * fVar188 + fVar174 * fVar189;
  fVar175 = fVar147 * fVar176 + fVar201 * fVar188 + fVar175 * fVar189;
  fVar190 = (float)(auVar194._12_4_ >> 0x18) * fVar176 +
            (float)(auVar75._12_4_ >> 0x18) * fVar188 + (float)(auVar78._12_4_ >> 0x18) * fVar189;
  fVar246 = fVar72 * fVar176 + fVar202 * fVar188 + fVar246 * fVar189;
  fVar212 = fVar118 * fVar176 + fVar212 * fVar188 + fVar257 * fVar189;
  fVar213 = fVar120 * fVar176 + fVar213 * fVar188 + fVar258 * fVar189;
  fVar257 = (float)(auVar81._12_4_ >> 0x18) * fVar176 +
            (float)(auVar204._12_4_ >> 0x18) * fVar188 + (float)(auVar216._12_4_ >> 0x18) * fVar189;
  fVar200 = fVar176 * fVar236 + fVar188 * fVar259 + fVar189 * fVar73;
  fVar201 = fVar176 * fVar244 + fVar188 * fVar262 + fVar189 * fVar119;
  fVar202 = fVar176 * fVar245 + fVar188 * fVar264 + fVar189 * fVar121;
  fVar176 = fVar176 * (float)(auVar219._12_4_ >> 0x18) +
            fVar188 * (float)(auVar222._12_4_ >> 0x18) + fVar189 * (float)(auVar270._12_4_ >> 0x18);
  fVar162 = (float)DAT_01ff1d40;
  fVar72 = DAT_01ff1d40._4_4_;
  fVar73 = DAT_01ff1d40._8_4_;
  fVar118 = DAT_01ff1d40._12_4_;
  uVar66 = -(uint)(fVar162 <= ABS(fVar276));
  uVar67 = -(uint)(fVar72 <= ABS(fVar277));
  uVar68 = -(uint)(fVar73 <= ABS(fVar278));
  uVar69 = -(uint)(fVar118 <= ABS(fVar279));
  auVar177._0_4_ = ~uVar66 & (uint)fVar162;
  auVar177._4_4_ = ~uVar67 & (uint)fVar72;
  auVar177._8_4_ = ~uVar68 & (uint)fVar73;
  auVar177._12_4_ = ~uVar69 & (uint)fVar118;
  auVar83._4_4_ = (uint)fVar277 & uVar67;
  auVar83._0_4_ = (uint)fVar276 & uVar66;
  auVar83._8_4_ = (uint)fVar278 & uVar68;
  auVar83._12_4_ = (uint)fVar279 & uVar69;
  auVar177 = auVar177 | auVar83;
  uVar66 = -(uint)(fVar162 <= ABS(fVar267));
  uVar67 = -(uint)(fVar72 <= ABS(fVar273));
  uVar68 = -(uint)(fVar73 <= ABS(fVar274));
  uVar69 = -(uint)(fVar118 <= ABS(fVar275));
  auVar272._0_4_ = (uint)fVar267 & uVar66;
  auVar272._4_4_ = (uint)fVar273 & uVar67;
  auVar272._8_4_ = (uint)fVar274 & uVar68;
  auVar272._12_4_ = (uint)fVar275 & uVar69;
  auVar191._0_4_ = ~uVar66 & (uint)fVar162;
  auVar191._4_4_ = ~uVar67 & (uint)fVar72;
  auVar191._8_4_ = ~uVar68 & (uint)fVar73;
  auVar191._12_4_ = ~uVar69 & (uint)fVar118;
  auVar191 = auVar191 | auVar272;
  uVar66 = -(uint)(fVar162 <= ABS(fVar214));
  uVar67 = -(uint)(fVar72 <= ABS(fVar234));
  uVar68 = -(uint)(fVar73 <= ABS(fVar235));
  uVar69 = -(uint)(fVar118 <= ABS(fVar148));
  auVar224._0_4_ = (uint)fVar214 & uVar66;
  auVar224._4_4_ = (uint)fVar234 & uVar67;
  auVar224._8_4_ = (uint)fVar235 & uVar68;
  auVar224._12_4_ = (uint)fVar148 & uVar69;
  auVar206._0_4_ = ~uVar66 & (uint)fVar162;
  auVar206._4_4_ = ~uVar67 & (uint)fVar72;
  auVar206._8_4_ = ~uVar68 & (uint)fVar73;
  auVar206._12_4_ = ~uVar69 & (uint)fVar118;
  auVar206 = auVar206 | auVar224;
  auVar83 = rcpps(_DAT_01ff1d40,auVar177);
  fVar162 = auVar83._0_4_;
  fVar118 = auVar83._4_4_;
  fVar121 = auVar83._8_4_;
  fVar147 = auVar83._12_4_;
  fVar162 = (1.0 - auVar177._0_4_ * fVar162) * fVar162 + fVar162;
  fVar118 = (1.0 - auVar177._4_4_ * fVar118) * fVar118 + fVar118;
  fVar121 = (1.0 - auVar177._8_4_ * fVar121) * fVar121 + fVar121;
  fVar147 = (1.0 - auVar177._12_4_ * fVar147) * fVar147 + fVar147;
  auVar83 = rcpps(auVar83,auVar191);
  fVar72 = auVar83._0_4_;
  fVar119 = auVar83._4_4_;
  fVar122 = auVar83._8_4_;
  fVar148 = auVar83._12_4_;
  fVar72 = (1.0 - auVar191._0_4_ * fVar72) * fVar72 + fVar72;
  fVar119 = (1.0 - auVar191._4_4_ * fVar119) * fVar119 + fVar119;
  fVar122 = (1.0 - auVar191._8_4_ * fVar122) * fVar122 + fVar122;
  fVar148 = (1.0 - auVar191._12_4_ * fVar148) * fVar148 + fVar148;
  auVar83 = rcpps(auVar83,auVar206);
  fVar73 = auVar83._0_4_;
  fVar120 = auVar83._4_4_;
  fVar146 = auVar83._8_4_;
  fVar161 = auVar83._12_4_;
  fVar73 = (1.0 - auVar206._0_4_ * fVar73) * fVar73 + fVar73;
  fVar120 = (1.0 - auVar206._4_4_ * fVar120) * fVar120 + fVar120;
  fVar146 = (1.0 - auVar206._8_4_ * fVar146) * fVar146 + fVar146;
  fVar161 = (1.0 - auVar206._12_4_ * fVar161) * fVar161 + fVar161;
  uVar63 = *(ulong *)(prim + uVar56 * 7 + 6);
  uVar117 = (undefined2)(uVar63 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar63;
  auVar86._12_2_ = uVar117;
  auVar86._14_2_ = uVar117;
  uVar117 = (undefined2)(uVar63 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar63;
  auVar85._10_2_ = uVar117;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar117;
  auVar84._0_8_ = uVar63;
  uVar117 = (undefined2)(uVar63 >> 0x10);
  auVar46._4_8_ = auVar84._8_8_;
  auVar46._2_2_ = uVar117;
  auVar46._0_2_ = uVar117;
  auVar178._0_8_ =
       CONCAT44(((float)(auVar46._0_4_ >> 0x10) - fVar174) * fVar118,
                ((float)(int)(short)uVar63 - fVar163) * fVar162);
  auVar178._8_4_ = ((float)(auVar84._8_4_ >> 0x10) - fVar175) * fVar121;
  auVar178._12_4_ = ((float)(auVar85._12_4_ >> 0x10) - fVar190) * fVar147;
  uVar63 = *(ulong *)(prim + uVar56 * 9 + 6);
  uVar117 = (undefined2)(uVar63 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar63;
  auVar89._12_2_ = uVar117;
  auVar89._14_2_ = uVar117;
  uVar117 = (undefined2)(uVar63 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar63;
  auVar88._10_2_ = uVar117;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar117;
  auVar87._0_8_ = uVar63;
  uVar117 = (undefined2)(uVar63 >> 0x10);
  auVar47._4_8_ = auVar87._8_8_;
  auVar47._2_2_ = uVar117;
  auVar47._0_2_ = uVar117;
  auVar207._0_4_ = ((float)(int)(short)uVar63 - fVar163) * fVar162;
  auVar207._4_4_ = ((float)(auVar47._0_4_ >> 0x10) - fVar174) * fVar118;
  auVar207._8_4_ = ((float)(auVar87._8_4_ >> 0x10) - fVar175) * fVar121;
  auVar207._12_4_ = ((float)(auVar88._12_4_ >> 0x10) - fVar190) * fVar147;
  uVar63 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  uVar64 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar56 * -2 + 6);
  uVar117 = (undefined2)(uVar64 >> 0x30);
  auVar125._8_4_ = 0;
  auVar125._0_8_ = uVar64;
  auVar125._12_2_ = uVar117;
  auVar125._14_2_ = uVar117;
  uVar117 = (undefined2)(uVar64 >> 0x20);
  auVar124._12_4_ = auVar125._12_4_;
  auVar124._8_2_ = 0;
  auVar124._0_8_ = uVar64;
  auVar124._10_2_ = uVar117;
  auVar123._10_6_ = auVar124._10_6_;
  auVar123._8_2_ = uVar117;
  auVar123._0_8_ = uVar64;
  uVar117 = (undefined2)(uVar64 >> 0x10);
  auVar48._4_8_ = auVar123._8_8_;
  auVar48._2_2_ = uVar117;
  auVar48._0_2_ = uVar117;
  auVar126._0_8_ =
       CONCAT44(((float)(auVar48._0_4_ >> 0x10) - fVar212) * fVar119,
                ((float)(int)(short)uVar64 - fVar246) * fVar72);
  auVar126._8_4_ = ((float)(auVar123._8_4_ >> 0x10) - fVar213) * fVar122;
  auVar126._12_4_ = ((float)(auVar124._12_4_ >> 0x10) - fVar257) * fVar148;
  uVar117 = (undefined2)(uVar63 >> 0x30);
  auVar92._8_4_ = 0;
  auVar92._0_8_ = uVar63;
  auVar92._12_2_ = uVar117;
  auVar92._14_2_ = uVar117;
  uVar117 = (undefined2)(uVar63 >> 0x20);
  auVar91._12_4_ = auVar92._12_4_;
  auVar91._8_2_ = 0;
  auVar91._0_8_ = uVar63;
  auVar91._10_2_ = uVar117;
  auVar90._10_6_ = auVar91._10_6_;
  auVar90._8_2_ = uVar117;
  auVar90._0_8_ = uVar63;
  uVar117 = (undefined2)(uVar63 >> 0x10);
  auVar49._4_8_ = auVar90._8_8_;
  auVar49._2_2_ = uVar117;
  auVar49._0_2_ = uVar117;
  auVar237._0_4_ = ((float)(int)(short)uVar63 - fVar246) * fVar72;
  auVar237._4_4_ = ((float)(auVar49._0_4_ >> 0x10) - fVar212) * fVar119;
  auVar237._8_4_ = ((float)(auVar90._8_4_ >> 0x10) - fVar213) * fVar122;
  auVar237._12_4_ = ((float)(auVar91._12_4_ >> 0x10) - fVar257) * fVar148;
  uVar63 = *(ulong *)(prim + uVar60 + uVar56 + 6);
  uVar117 = (undefined2)(uVar63 >> 0x30);
  auVar95._8_4_ = 0;
  auVar95._0_8_ = uVar63;
  auVar95._12_2_ = uVar117;
  auVar95._14_2_ = uVar117;
  uVar117 = (undefined2)(uVar63 >> 0x20);
  auVar94._12_4_ = auVar95._12_4_;
  auVar94._8_2_ = 0;
  auVar94._0_8_ = uVar63;
  auVar94._10_2_ = uVar117;
  auVar93._10_6_ = auVar94._10_6_;
  auVar93._8_2_ = uVar117;
  auVar93._0_8_ = uVar63;
  uVar117 = (undefined2)(uVar63 >> 0x10);
  auVar50._4_8_ = auVar93._8_8_;
  auVar50._2_2_ = uVar117;
  auVar50._0_2_ = uVar117;
  auVar96._0_8_ =
       CONCAT44(((float)(auVar50._0_4_ >> 0x10) - fVar201) * fVar120,
                ((float)(int)(short)uVar63 - fVar200) * fVar73);
  auVar96._8_4_ = ((float)(auVar93._8_4_ >> 0x10) - fVar202) * fVar146;
  auVar96._12_4_ = ((float)(auVar94._12_4_ >> 0x10) - fVar176) * fVar161;
  local_410 = prim;
  uVar63 = *(ulong *)(prim + uVar56 * 0x17 + 6);
  uVar117 = (undefined2)(uVar63 >> 0x30);
  auVar227._8_4_ = 0;
  auVar227._0_8_ = uVar63;
  auVar227._12_2_ = uVar117;
  auVar227._14_2_ = uVar117;
  uVar117 = (undefined2)(uVar63 >> 0x20);
  auVar226._12_4_ = auVar227._12_4_;
  auVar226._8_2_ = 0;
  auVar226._0_8_ = uVar63;
  auVar226._10_2_ = uVar117;
  auVar225._10_6_ = auVar226._10_6_;
  auVar225._8_2_ = uVar117;
  auVar225._0_8_ = uVar63;
  uVar117 = (undefined2)(uVar63 >> 0x10);
  auVar51._4_8_ = auVar225._8_8_;
  auVar51._2_2_ = uVar117;
  auVar51._0_2_ = uVar117;
  auVar228._0_4_ = ((float)(int)(short)uVar63 - fVar200) * fVar73;
  auVar228._4_4_ = ((float)(auVar51._0_4_ >> 0x10) - fVar201) * fVar120;
  auVar228._8_4_ = ((float)(auVar225._8_4_ >> 0x10) - fVar202) * fVar146;
  auVar228._12_4_ = ((float)(auVar226._12_4_ >> 0x10) - fVar176) * fVar161;
  auVar192._8_4_ = auVar178._8_4_;
  auVar192._0_8_ = auVar178._0_8_;
  auVar192._12_4_ = auVar178._12_4_;
  auVar193 = minps(auVar192,auVar207);
  auVar149._8_4_ = auVar126._8_4_;
  auVar149._0_8_ = auVar126._0_8_;
  auVar149._12_4_ = auVar126._12_4_;
  auVar83 = minps(auVar149,auVar237);
  auVar193 = maxps(auVar193,auVar83);
  auVar150._8_4_ = auVar96._8_4_;
  auVar150._0_8_ = auVar96._0_8_;
  auVar150._12_4_ = auVar96._12_4_;
  auVar83 = minps(auVar150,auVar228);
  auVar164._4_4_ = uVar6;
  auVar164._0_4_ = uVar6;
  auVar164._8_4_ = uVar6;
  auVar164._12_4_ = uVar6;
  auVar83 = maxps(auVar83,auVar164);
  auVar194 = maxps(auVar193,auVar83);
  auVar193 = maxps(auVar178,auVar207);
  auVar83 = maxps(auVar126,auVar237);
  auVar193 = minps(auVar193,auVar83);
  local_228 = auVar194._0_4_ * 0.99999964;
  fStack_224 = auVar194._4_4_ * 0.99999964;
  fStack_220 = auVar194._8_4_ * 0.99999964;
  fStack_21c = auVar194._12_4_ * 0.99999964;
  auVar83 = maxps(auVar96,auVar228);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar127._4_4_ = uVar6;
  auVar127._0_4_ = uVar6;
  auVar127._8_4_ = uVar6;
  auVar127._12_4_ = uVar6;
  auVar83 = minps(auVar83,auVar127);
  auVar83 = minps(auVar193,auVar83);
  auVar128._0_4_ = -(uint)(PVar5 != (Primitive)0x0 && local_228 <= auVar83._0_4_ * 1.0000004);
  auVar128._4_4_ = -(uint)(1 < (byte)PVar5 && fStack_224 <= auVar83._4_4_ * 1.0000004);
  auVar128._8_4_ = -(uint)(2 < (byte)PVar5 && fStack_220 <= auVar83._8_4_ * 1.0000004);
  auVar128._12_4_ = -(uint)(3 < (byte)PVar5 && fStack_21c <= auVar83._12_4_ * 1.0000004);
  uVar66 = movmskps((uint)(byte)PVar5,auVar128);
  if (uVar66 == 0) {
    return;
  }
  uVar66 = uVar66 & 0xff;
  local_208._0_12_ = mm_lookupmask_ps._240_12_;
  local_208._12_4_ = 0;
  local_418 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_358 = prim + uVar56 * 0x19 + 0x16;
LAB_00afe112:
  local_350 = (ulong)uVar66;
  lVar54 = 0;
  if (local_350 != 0) {
    for (; (uVar66 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
    }
  }
  local_350 = local_350 - 1 & local_350;
  uVar6 = *(undefined4 *)(local_410 + lVar54 * 4 + 6);
  lVar54 = lVar54 * 0x40;
  lVar8 = 0;
  if (local_350 != 0) {
    for (; (local_350 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
    }
  }
  uVar66 = *(uint *)(local_410 + 2);
  uVar63 = (ulong)uVar66;
  pPVar1 = local_358 + lVar54;
  pRVar62 = (RTCIntersectArguments *)(local_350 - 1);
  if ((local_350 != 0) &&
     (pRVar62 = (RTCIntersectArguments *)((ulong)pRVar62 & local_350),
     pRVar62 != (RTCIntersectArguments *)0x0)) {
    lVar8 = 0;
    if (pRVar62 != (RTCIntersectArguments *)0x0) {
      for (; ((ulong)pRVar62 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
      }
    }
    pRVar62 = (RTCIntersectArguments *)(lVar8 << 6);
  }
  pPVar2 = local_358 + lVar54 + 0x10;
  pPVar3 = local_358 + lVar54 + 0x20;
  pPVar4 = local_358 + lVar54 + 0x30;
  fStack_11c = *(float *)(ray + k * 4 + 0x40);
  local_498 = *(float *)(ray + k * 4 + 0x50);
  fVar72 = *(float *)(ray + k * 4 + 0x60);
  fVar162 = local_498 * local_498;
  fVar73 = fVar72 * fVar72;
  fVar122 = fVar162 + fStack_11c * fStack_11c + fVar73;
  local_3f8._0_8_ = CONCAT44(fVar162 + fVar162 + 0.0,fVar122);
  local_3f8._8_4_ = fVar162 + fVar73 + fVar73;
  local_3f8._12_4_ = fVar162 + 0.0 + 0.0;
  auVar179._8_4_ = local_3f8._8_4_;
  auVar179._0_8_ = local_3f8._0_8_;
  auVar179._12_4_ = local_3f8._12_4_;
  auVar83 = rcpss(auVar179,local_3f8);
  local_478 = (2.0 - fVar122 * auVar83._0_4_) * auVar83._0_4_ *
              (((*(float *)(pPVar1 + 8) + *(float *)(pPVar2 + 8) + *(float *)(pPVar3 + 8) +
                *(float *)(pPVar4 + 8)) * 0.25 - *(float *)(ray + k * 4 + 0x20)) * fVar72 +
              ((*(float *)(pPVar1 + 4) + *(float *)(pPVar2 + 4) + *(float *)(pPVar3 + 4) +
               *(float *)(pPVar4 + 4)) * 0.25 - *(float *)(ray + k * 4 + 0x10)) * local_498 +
              ((*(float *)pPVar1 + *(float *)pPVar2 + *(float *)pPVar3 + *(float *)pPVar4) * 0.25 -
              *(float *)(ray + k * 4)) * fStack_11c);
  local_3e8._4_4_ = local_498;
  local_3e8._0_4_ = fStack_11c;
  fStack_3e0 = fVar72;
  fStack_3dc = 0.0;
  fStack_474 = local_478;
  fStack_470 = local_478;
  fStack_46c = local_478;
  local_1b8 = fStack_11c * local_478 + *(float *)(ray + k * 4);
  local_1c8 = local_498 * local_478 + *(float *)(ray + k * 4 + 0x10);
  local_1d8 = fVar72 * local_478 + *(float *)(ray + k * 4 + 0x20);
  fVar118 = *(float *)pPVar1 - local_1b8;
  fVar119 = *(float *)(pPVar1 + 4) - local_1c8;
  fVar120 = *(float *)(pPVar1 + 8) - local_1d8;
  fVar121 = *(float *)(pPVar1 + 0xc) - 0.0;
  local_198 = *(float *)pPVar3 - local_1b8;
  local_1a8 = *(float *)(pPVar3 + 4) - local_1c8;
  local_308 = *(float *)(pPVar3 + 8) - local_1d8;
  fStack_4ec = *(float *)(pPVar3 + 0xc) - 0.0;
  local_178 = *(float *)pPVar2 - local_1b8;
  local_188 = *(float *)(pPVar2 + 4) - local_1c8;
  local_2e8 = *(float *)(pPVar2 + 8) - local_1d8;
  fStack_4dc = *(float *)(pPVar2 + 0xc) - 0.0;
  local_1b8 = *(float *)pPVar4 - local_1b8;
  local_1c8 = *(float *)(pPVar4 + 4) - local_1c8;
  local_1d8 = *(float *)(pPVar4 + 8) - local_1d8;
  fStack_4fc = *(float *)(pPVar4 + 0xc) - 0.0;
  local_138 = fVar118;
  fStack_134 = fVar118;
  fStack_130 = fVar118;
  fStack_12c = fVar118;
  local_148 = fVar119;
  fStack_144 = fVar119;
  fStack_140 = fVar119;
  fStack_13c = fVar119;
  local_158 = fVar120;
  fStack_154 = fVar120;
  fStack_150 = fVar120;
  fStack_14c = fVar120;
  local_168 = fVar121;
  fStack_164 = fVar121;
  fStack_160 = fVar121;
  fStack_15c = fVar121;
  fVar162 = local_498 * local_498;
  fStack_174 = local_178;
  fStack_170 = local_178;
  fStack_16c = local_178;
  fStack_11c = fStack_11c * fStack_11c;
  local_128 = fStack_11c + fVar162 + fVar73;
  fStack_124 = fStack_11c + fVar162 + fVar73;
  fStack_120 = fStack_11c + fVar162 + fVar73;
  fStack_11c = fStack_11c + fVar162 + fVar73;
  fStack_184 = local_188;
  fStack_180 = local_188;
  fStack_17c = local_188;
  fStack_2e4 = local_2e8;
  fStack_2e0 = local_2e8;
  fStack_2dc = local_2e8;
  local_4e8 = local_178;
  fStack_4e4 = local_188;
  fStack_4e0 = local_2e8;
  local_2f8 = fStack_4dc;
  fStack_2f4 = fStack_4dc;
  fStack_2f0 = fStack_4dc;
  fStack_2ec = fStack_4dc;
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_1a4 = local_1a8;
  fStack_1a0 = local_1a8;
  fStack_19c = local_1a8;
  fStack_304 = local_308;
  fStack_300 = local_308;
  fStack_2fc = local_308;
  local_4f8 = local_198;
  fStack_4f4 = local_1a8;
  fStack_4f0 = local_308;
  local_318 = fStack_4ec;
  fStack_314 = fStack_4ec;
  fStack_310 = fStack_4ec;
  fStack_30c = fStack_4ec;
  fStack_1b4 = local_1b8;
  fStack_1b0 = local_1b8;
  fStack_1ac = local_1b8;
  fStack_1c4 = local_1c8;
  fStack_1c0 = local_1c8;
  fStack_1bc = local_1c8;
  fStack_1d4 = local_1d8;
  fStack_1d0 = local_1d8;
  fStack_1cc = local_1d8;
  local_508 = local_1b8;
  fStack_504 = local_1c8;
  fStack_500 = local_1d8;
  local_1e8 = fStack_4fc;
  fStack_1e4 = fStack_4fc;
  fStack_1e0 = fStack_4fc;
  fStack_1dc = fStack_4fc;
  local_408 = *(float *)(ray + k * 4 + 0x40);
  local_328 = ABS(local_128);
  fStack_324 = ABS(fStack_124);
  fStack_320 = ABS(fStack_120);
  fStack_31c = ABS(fStack_11c);
  fVar162 = *(float *)(ray + k * 4 + 0x30);
  local_388 = ZEXT416((uint)local_478);
  local_1f8 = fVar162 - local_478;
  fStack_1f4 = local_1f8;
  fStack_1f0 = local_1f8;
  fStack_1ec = local_1f8;
  local_338 = uVar66;
  uStack_334 = uVar66;
  uStack_330 = uVar66;
  uStack_32c = uVar66;
  local_348 = uVar6;
  uStack_344 = uVar6;
  uStack_340 = uVar6;
  uStack_33c = uVar6;
  local_560 = 1;
  uVar60 = 0;
  local_4a8 = 0.0;
  fStack_4a4 = 1.0;
  uStack_4a0 = 0;
  uStack_49c = 0;
  fStack_494 = local_498;
  fStack_490 = local_498;
  fStack_48c = local_498;
  fStack_404 = local_408;
  fStack_400 = local_408;
  fStack_3fc = local_408;
  uVar56 = 1;
  uVar64 = uVar63;
  do {
    local_448 = fStack_4a4 - local_4a8;
    fStack_444 = local_448;
    fStack_440 = local_448;
    fStack_43c = local_448;
    local_458._4_4_ = local_4a8;
    local_458._0_4_ = local_4a8;
    fStack_450 = local_4a8;
    fStack_44c = local_4a8;
    fVar161 = local_448 * 0.0 + local_4a8;
    fVar163 = local_448 * 0.33333334 + local_4a8;
    fVar174 = local_448 * 0.6666667 + local_4a8;
    fVar175 = local_448 * 1.0 + local_4a8;
    fVar190 = 1.0 - fVar161;
    fVar200 = 1.0 - fVar163;
    fVar201 = 1.0 - fVar174;
    fVar202 = 1.0 - fVar175;
    fVar275 = local_178 * fVar190 + local_198 * fVar161;
    fVar276 = fStack_174 * fVar200 + fStack_194 * fVar163;
    fVar277 = fStack_170 * fVar201 + fStack_190 * fVar174;
    fVar278 = fStack_16c * fVar202 + fStack_18c * fVar175;
    fVar279 = local_188 * fVar190 + local_1a8 * fVar161;
    fVar263 = fStack_184 * fVar200 + fStack_1a4 * fVar163;
    fVar265 = fStack_180 * fVar201 + fStack_1a0 * fVar174;
    fVar266 = fStack_17c * fVar202 + fStack_19c * fVar175;
    fVar213 = local_2e8 * fVar190 + local_308 * fVar161;
    fVar214 = fStack_2e4 * fVar200 + fStack_304 * fVar163;
    fVar234 = fStack_2e0 * fVar201 + fStack_300 * fVar174;
    fVar235 = fStack_2dc * fVar202 + fStack_2fc * fVar175;
    fVar264 = local_2f8 * fVar190 + local_318 * fVar161;
    fVar267 = fStack_2f4 * fVar200 + fStack_314 * fVar163;
    fVar273 = fStack_2f0 * fVar201 + fStack_310 * fVar174;
    fVar274 = fStack_2ec * fVar202 + fStack_30c * fVar175;
    fVar176 = (local_138 * fVar190 + local_178 * fVar161) * fVar190 + fVar161 * fVar275;
    fVar188 = (fStack_134 * fVar200 + fStack_174 * fVar163) * fVar200 + fVar163 * fVar276;
    fVar189 = (fStack_130 * fVar201 + fStack_170 * fVar174) * fVar201 + fVar174 * fVar277;
    fVar212 = (fStack_12c * fVar202 + fStack_16c * fVar175) * fVar202 + fVar175 * fVar278;
    fVar73 = (local_148 * fVar190 + local_188 * fVar161) * fVar190 + fVar161 * fVar279;
    fVar146 = (fStack_144 * fVar200 + fStack_184 * fVar163) * fVar200 + fVar163 * fVar263;
    fVar147 = (fStack_140 * fVar201 + fStack_180 * fVar174) * fVar201 + fVar174 * fVar265;
    fVar148 = (fStack_13c * fVar202 + fStack_17c * fVar175) * fVar202 + fVar175 * fVar266;
    fVar236 = (local_158 * fVar190 + local_2e8 * fVar161) * fVar190 + fVar161 * fVar213;
    fVar244 = (fStack_154 * fVar200 + fStack_2e4 * fVar163) * fVar200 + fVar163 * fVar214;
    fVar245 = (fStack_150 * fVar201 + fStack_2e0 * fVar174) * fVar201 + fVar174 * fVar234;
    fVar246 = (fStack_14c * fVar202 + fStack_2dc * fVar175) * fVar202 + fVar175 * fVar235;
    fVar257 = (local_168 * fVar190 + local_2f8 * fVar161) * fVar190 + fVar161 * fVar264;
    fVar258 = (fStack_164 * fVar200 + fStack_2f4 * fVar163) * fVar200 + fVar163 * fVar267;
    fVar259 = (fStack_160 * fVar201 + fStack_2f0 * fVar174) * fVar201 + fVar174 * fVar273;
    fVar262 = (fStack_15c * fVar202 + fStack_2ec * fVar175) * fVar202 + fVar175 * fVar274;
    fVar275 = fVar275 * fVar190 + (local_198 * fVar190 + local_1b8 * fVar161) * fVar161;
    fVar276 = fVar276 * fVar200 + (fStack_194 * fVar200 + fStack_1b4 * fVar163) * fVar163;
    fVar277 = fVar277 * fVar201 + (fStack_190 * fVar201 + fStack_1b0 * fVar174) * fVar174;
    fVar278 = fVar278 * fVar202 + (fStack_18c * fVar202 + fStack_1ac * fVar175) * fVar175;
    fVar279 = fVar279 * fVar190 + (local_1a8 * fVar190 + local_1c8 * fVar161) * fVar161;
    fVar263 = fVar263 * fVar200 + (fStack_1a4 * fVar200 + fStack_1c4 * fVar163) * fVar163;
    fVar265 = fVar265 * fVar201 + (fStack_1a0 * fVar201 + fStack_1c0 * fVar174) * fVar174;
    fVar266 = fVar266 * fVar202 + (fStack_19c * fVar202 + fStack_1bc * fVar175) * fVar175;
    fVar213 = fVar213 * fVar190 + (local_308 * fVar190 + local_1d8 * fVar161) * fVar161;
    fVar214 = fVar214 * fVar200 + (fStack_304 * fVar200 + fStack_1d4 * fVar163) * fVar163;
    fVar234 = fVar234 * fVar201 + (fStack_300 * fVar201 + fStack_1d0 * fVar174) * fVar174;
    fVar235 = fVar235 * fVar202 + (fStack_2fc * fVar202 + fStack_1cc * fVar175) * fVar175;
    fVar264 = fVar264 * fVar190 + (local_318 * fVar190 + local_1e8 * fVar161) * fVar161;
    fVar267 = fVar267 * fVar200 + (fStack_314 * fVar200 + fStack_1e4 * fVar163) * fVar163;
    fVar273 = fVar273 * fVar201 + (fStack_310 * fVar201 + fStack_1e0 * fVar174) * fVar174;
    fVar274 = fVar274 * fVar202 + (fStack_30c * fVar202 + fStack_1dc * fVar175) * fVar175;
    fVar280 = fVar190 * fVar176 + fVar161 * fVar275;
    fVar283 = fVar200 * fVar188 + fVar163 * fVar276;
    fVar284 = fVar201 * fVar189 + fVar174 * fVar277;
    fVar285 = fVar202 * fVar212 + fVar175 * fVar278;
    fVar286 = fVar190 * fVar73 + fVar161 * fVar279;
    fVar287 = fVar200 * fVar146 + fVar163 * fVar263;
    fVar288 = fVar201 * fVar147 + fVar174 * fVar265;
    fVar289 = fVar202 * fVar148 + fVar175 * fVar266;
    local_518 = fVar190 * fVar236 + fVar161 * fVar213;
    fStack_514 = fVar200 * fVar244 + fVar163 * fVar214;
    fStack_510 = fVar201 * fVar245 + fVar174 * fVar234;
    fStack_50c = fVar202 * fVar246 + fVar175 * fVar235;
    fVar268 = local_448 * 0.11111111;
    fVar161 = fVar190 * fVar257 + fVar161 * fVar264;
    fVar163 = fVar200 * fVar258 + fVar163 * fVar267;
    auVar151._0_8_ = CONCAT44(fVar163,fVar161);
    auVar151._8_4_ = fVar201 * fVar259 + fVar174 * fVar273;
    auVar151._12_4_ = fVar202 * fVar262 + fVar175 * fVar274;
    fVar275 = (fVar275 - fVar176) * 3.0 * fVar268;
    fVar276 = (fVar276 - fVar188) * 3.0 * fVar268;
    fVar277 = (fVar277 - fVar189) * 3.0 * fVar268;
    fVar278 = (fVar278 - fVar212) * 3.0 * fVar268;
    fVar279 = (fVar279 - fVar73) * 3.0 * fVar268;
    local_428 = (fVar263 - fVar146) * 3.0 * fVar268;
    fStack_424 = (fVar265 - fVar147) * 3.0 * fVar268;
    fStack_420 = (fVar266 - fVar148) * 3.0 * fVar268;
    fVar190 = (fVar213 - fVar236) * 3.0 * fVar268;
    local_438 = (fVar214 - fVar244) * 3.0 * fVar268;
    fStack_434 = (fVar234 - fVar245) * 3.0 * fVar268;
    fStack_430 = (fVar235 - fVar246) * 3.0 * fVar268;
    fVar73 = fVar268 * (fVar267 - fVar258) * 3.0;
    fVar146 = fVar268 * (fVar273 - fVar259) * 3.0;
    fVar147 = fVar268 * (fVar274 - fVar262) * 3.0;
    auVar129._4_4_ = auVar151._8_4_;
    auVar129._0_4_ = fVar163;
    auVar129._8_4_ = auVar151._12_4_;
    auVar129._12_4_ = 0;
    local_668._4_4_ = fVar163 + fVar73;
    local_668._0_4_ = fVar161 + fVar268 * (fVar264 - fVar257) * 3.0;
    fStack_660 = auVar151._8_4_ + fVar146;
    fStack_65c = auVar151._12_4_ + fVar147;
    auVar130._0_8_ = CONCAT44(auVar151._8_4_ - fVar146,fVar163 - fVar73);
    auVar130._8_4_ = auVar151._12_4_ - fVar147;
    auVar130._12_4_ = 0;
    local_488 = fVar287 - fVar286;
    fStack_484 = fVar288 - fVar287;
    fStack_480 = fVar289 - fVar288;
    fStack_47c = 0.0 - fVar289;
    local_4b8._0_4_ = fStack_514 - local_518;
    local_4b8._4_4_ = fStack_510 - fStack_514;
    fStack_4b0 = fStack_50c - fStack_510;
    fStack_4ac = 0.0 - fStack_50c;
    fVar73 = fVar279 * (float)local_4b8._0_4_ - fVar190 * local_488;
    fVar146 = local_428 * (float)local_4b8._4_4_ - local_438 * fStack_484;
    fVar147 = fStack_424 * fStack_4b0 - fStack_434 * fStack_480;
    fVar148 = fStack_420 * fStack_4ac - fStack_430 * fStack_47c;
    local_4c8._0_4_ = fVar283 - fVar280;
    local_4c8._4_4_ = fVar284 - fVar283;
    fStack_4c0 = fVar285 - fVar284;
    fStack_4bc = 0.0 - fVar285;
    fVar161 = fVar190 * (float)local_4c8._0_4_ - fVar275 * (float)local_4b8._0_4_;
    fVar174 = local_438 * (float)local_4c8._4_4_ - fVar276 * (float)local_4b8._4_4_;
    fVar200 = fStack_434 * fStack_4c0 - fVar277 * fStack_4b0;
    fVar202 = fStack_430 * fStack_4bc - fVar278 * fStack_4ac;
    fVar163 = fVar275 * local_488 - fVar279 * (float)local_4c8._0_4_;
    fVar175 = fVar276 * fStack_484 - local_428 * (float)local_4c8._4_4_;
    fVar201 = fVar277 * fStack_480 - fStack_424 * fStack_4c0;
    fVar176 = fVar278 * fStack_47c - fStack_420 * fStack_4bc;
    auVar229._0_4_ = fVar163 * fVar163;
    auVar229._4_4_ = fVar175 * fVar175;
    auVar229._8_4_ = fVar201 * fVar201;
    auVar229._12_4_ = fVar176 * fVar176;
    auVar165._0_4_ =
         (float)local_4c8._0_4_ * (float)local_4c8._0_4_ +
         local_488 * local_488 + (float)local_4b8._0_4_ * (float)local_4b8._0_4_;
    auVar165._4_4_ =
         (float)local_4c8._4_4_ * (float)local_4c8._4_4_ +
         fStack_484 * fStack_484 + (float)local_4b8._4_4_ * (float)local_4b8._4_4_;
    auVar165._8_4_ = fStack_4c0 * fStack_4c0 + fStack_480 * fStack_480 + fStack_4b0 * fStack_4b0;
    auVar165._12_4_ = fStack_4bc * fStack_4bc + fStack_47c * fStack_47c + fStack_4ac * fStack_4ac;
    auVar83 = rcpps(auVar229,auVar165);
    fVar163 = auVar83._0_4_;
    fVar175 = auVar83._4_4_;
    fVar201 = auVar83._8_4_;
    fVar176 = auVar83._12_4_;
    fVar163 = (1.0 - fVar163 * auVar165._0_4_) * fVar163 + fVar163;
    fVar175 = (1.0 - fVar175 * auVar165._4_4_) * fVar175 + fVar175;
    fVar201 = (1.0 - fVar201 * auVar165._8_4_) * fVar201 + fVar201;
    fVar176 = (1.0 - fVar176 * auVar165._12_4_) * fVar176 + fVar176;
    fVar188 = (float)local_4b8._0_4_ * local_428 - local_488 * local_438;
    fVar189 = (float)local_4b8._4_4_ * fStack_424 - fStack_484 * fStack_434;
    fVar212 = fStack_4b0 * fStack_420 - fStack_480 * fStack_430;
    fVar213 = fStack_4ac * 0.0 - fStack_47c * 0.0;
    uStack_42c = 0;
    fVar214 = (float)local_4c8._0_4_ * local_438 - (float)local_4b8._0_4_ * fVar276;
    fVar234 = (float)local_4c8._4_4_ * fStack_434 - (float)local_4b8._4_4_ * fVar277;
    fVar235 = fStack_4c0 * fStack_430 - fStack_4b0 * fVar278;
    fVar236 = fStack_4bc * 0.0 - fStack_4ac * 0.0;
    fStack_41c = 0.0;
    fVar244 = local_488 * fVar276 - (float)local_4c8._0_4_ * local_428;
    fVar245 = fStack_484 * fVar277 - (float)local_4c8._4_4_ * fStack_424;
    fVar246 = fStack_480 * fVar278 - fStack_4c0 * fStack_420;
    fVar257 = fStack_47c * 0.0 - fStack_4bc * 0.0;
    auVar281._0_4_ = fVar244 * fVar244;
    auVar281._4_4_ = fVar245 * fVar245;
    auVar281._8_4_ = fVar246 * fVar246;
    auVar281._12_4_ = fVar257 * fVar257;
    auVar97._0_4_ = (fVar73 * fVar73 + fVar161 * fVar161 + auVar229._0_4_) * fVar163;
    auVar97._4_4_ = (fVar146 * fVar146 + fVar174 * fVar174 + auVar229._4_4_) * fVar175;
    auVar97._8_4_ = (fVar147 * fVar147 + fVar200 * fVar200 + auVar229._8_4_) * fVar201;
    auVar97._12_4_ = (fVar148 * fVar148 + fVar202 * fVar202 + auVar229._12_4_) * fVar176;
    auVar238._0_4_ = (fVar188 * fVar188 + fVar214 * fVar214 + auVar281._0_4_) * fVar163;
    auVar238._4_4_ = (fVar189 * fVar189 + fVar234 * fVar234 + auVar281._4_4_) * fVar175;
    auVar238._8_4_ = (fVar212 * fVar212 + fVar235 * fVar235 + auVar281._8_4_) * fVar201;
    auVar238._12_4_ = (fVar213 * fVar213 + fVar236 * fVar236 + auVar281._12_4_) * fVar176;
    auVar83 = maxps(auVar97,auVar238);
    auVar230._8_4_ = auVar151._8_4_;
    auVar230._0_8_ = auVar151._0_8_;
    auVar230._12_4_ = auVar151._12_4_;
    auVar194 = maxps(auVar230,_local_668);
    auVar195._8_4_ = auVar130._8_4_;
    auVar195._0_8_ = auVar130._0_8_;
    auVar195._12_4_ = 0;
    auVar193 = maxps(auVar195,auVar129);
    auVar231 = maxps(auVar194,auVar193);
    auVar194 = minps(auVar151,_local_668);
    auVar193 = minps(auVar130,auVar129);
    auVar193 = minps(auVar194,auVar193);
    auVar83 = sqrtps(auVar83,auVar83);
    auVar194 = rsqrtps(auVar281,auVar165);
    fVar73 = auVar194._0_4_;
    fVar146 = auVar194._4_4_;
    fVar147 = auVar194._8_4_;
    fVar148 = auVar194._12_4_;
    local_218 = fVar73 * fVar73 * auVar165._0_4_ * -0.5 * fVar73 + fVar73 * 1.5;
    fStack_214 = fVar146 * fVar146 * auVar165._4_4_ * -0.5 * fVar146 + fVar146 * 1.5;
    fStack_210 = fVar147 * fVar147 * auVar165._8_4_ * -0.5 * fVar147 + fVar147 * 1.5;
    fStack_20c = fVar148 * fVar148 * auVar165._12_4_ * -0.5 * fVar148 + fVar148 * 1.5;
    fVar73 = 0.0 - fVar286;
    fVar146 = 0.0 - fVar287;
    fVar147 = 0.0 - fVar288;
    fVar148 = 0.0 - fVar289;
    fVar188 = 0.0 - local_518;
    fVar189 = 0.0 - fStack_514;
    fVar212 = 0.0 - fStack_510;
    fVar213 = 0.0 - fStack_50c;
    fVar244 = 0.0 - fVar280;
    fVar245 = 0.0 - fVar283;
    fVar246 = 0.0 - fVar284;
    fVar257 = 0.0 - fVar285;
    local_398._0_4_ =
         local_408 * (float)local_4c8._0_4_ * local_218 +
         local_498 * local_488 * local_218 + fVar72 * (float)local_4b8._0_4_ * local_218;
    local_398._4_4_ =
         fStack_404 * (float)local_4c8._4_4_ * fStack_214 +
         fStack_494 * fStack_484 * fStack_214 + fVar72 * (float)local_4b8._4_4_ * fStack_214;
    fStack_390 = fStack_400 * fStack_4c0 * fStack_210 +
                 fStack_490 * fStack_480 * fStack_210 + fVar72 * fStack_4b0 * fStack_210;
    fStack_38c = fStack_3fc * fStack_4bc * fStack_20c +
                 fStack_48c * fStack_47c * fStack_20c + fVar72 * fStack_4ac * fStack_20c;
    local_3b8 = (float)local_4c8._0_4_ * local_218 * fVar244 +
                local_488 * local_218 * fVar73 + (float)local_4b8._0_4_ * local_218 * fVar188;
    fStack_3b4 = (float)local_4c8._4_4_ * fStack_214 * fVar245 +
                 fStack_484 * fStack_214 * fVar146 + (float)local_4b8._4_4_ * fStack_214 * fVar189;
    fStack_3b0 = fStack_4c0 * fStack_210 * fVar246 +
                 fStack_480 * fStack_210 * fVar147 + fStack_4b0 * fStack_210 * fVar212;
    fStack_3ac = fStack_4bc * fStack_20c * fVar257 +
                 fStack_47c * fStack_20c * fVar148 + fStack_4ac * fStack_20c * fVar213;
    fVar214 = (local_408 * fVar244 + local_498 * fVar73 + fVar72 * fVar188) -
              (float)local_398._0_4_ * local_3b8;
    fVar234 = (fStack_404 * fVar245 + fStack_494 * fVar146 + fVar72 * fVar189) -
              (float)local_398._4_4_ * fStack_3b4;
    fVar235 = (fStack_400 * fVar246 + fStack_490 * fVar147 + fVar72 * fVar212) -
              fStack_390 * fStack_3b0;
    fVar236 = (fStack_3fc * fVar257 + fStack_48c * fVar148 + fVar72 * fVar213) -
              fStack_38c * fStack_3ac;
    fVar200 = (fVar244 * fVar244 + fVar73 * fVar73 + fVar188 * fVar188) - local_3b8 * local_3b8;
    fVar201 = (fVar245 * fVar245 + fVar146 * fVar146 + fVar189 * fVar189) - fStack_3b4 * fStack_3b4;
    fVar202 = (fVar246 * fVar246 + fVar147 * fVar147 + fVar212 * fVar212) - fStack_3b0 * fStack_3b0;
    fVar176 = (fVar257 * fVar257 + fVar148 * fVar148 + fVar213 * fVar213) - fStack_3ac * fStack_3ac;
    fVar161 = (auVar231._0_4_ + auVar83._0_4_) * 1.0000002;
    fVar163 = (auVar231._4_4_ + auVar83._4_4_) * 1.0000002;
    fVar174 = (auVar231._8_4_ + auVar83._8_4_) * 1.0000002;
    fVar175 = (auVar231._12_4_ + auVar83._12_4_) * 1.0000002;
    auVar196._0_4_ = fVar200 - fVar161 * fVar161;
    auVar196._4_4_ = fVar201 - fVar163 * fVar163;
    auVar196._8_4_ = fVar202 - fVar174 * fVar174;
    auVar196._12_4_ = fVar176 - fVar175 * fVar175;
    local_3a8._0_4_ = (float)local_398._0_4_ * (float)local_398._0_4_;
    local_3a8._4_4_ = (float)local_398._4_4_ * (float)local_398._4_4_;
    fStack_3a0 = fStack_390 * fStack_390;
    fStack_39c = fStack_38c * fStack_38c;
    fVar161 = local_128 - (float)local_3a8._0_4_;
    fVar163 = fStack_124 - (float)local_3a8._4_4_;
    fVar174 = fStack_120 - fStack_3a0;
    fVar175 = fStack_11c - fStack_39c;
    local_528._0_4_ = fVar214 + fVar214;
    local_528._4_4_ = fVar234 + fVar234;
    fStack_520 = fVar235 + fVar235;
    fStack_51c = fVar236 + fVar236;
    local_4d8._0_4_ = fVar161 * 4.0;
    local_4d8._4_4_ = fVar163 * 4.0;
    fStack_4d0 = fVar174 * 4.0;
    fStack_4cc = fVar175 * 4.0;
    auVar232._0_4_ =
         (float)local_528._0_4_ * (float)local_528._0_4_ - (float)local_4d8._0_4_ * auVar196._0_4_;
    auVar232._4_4_ =
         (float)local_528._4_4_ * (float)local_528._4_4_ - (float)local_4d8._4_4_ * auVar196._4_4_;
    auVar232._8_4_ = fStack_520 * fStack_520 - fStack_4d0 * auVar196._8_4_;
    auVar232._12_4_ = fStack_51c * fStack_51c - fStack_4cc * auVar196._12_4_;
    local_468 = (auVar193._0_4_ - auVar83._0_4_) * 0.99999976;
    fStack_464 = (auVar193._4_4_ - auVar83._4_4_) * 0.99999976;
    fStack_460 = (auVar193._8_4_ - auVar83._8_4_) * 0.99999976;
    fStack_45c = (auVar193._12_4_ - auVar83._12_4_) * 0.99999976;
    auVar180._4_4_ = -(uint)(0.0 <= auVar232._4_4_);
    auVar180._0_4_ = -(uint)(0.0 <= auVar232._0_4_);
    auVar180._8_4_ = -(uint)(0.0 <= auVar232._8_4_);
    auVar180._12_4_ = -(uint)(0.0 <= auVar232._12_4_);
    uVar61 = 0;
    iVar52 = movmskps((int)uVar56,auVar180);
    if (iVar52 == 0) {
      iVar52 = 0;
      auVar132 = _DAT_01feb9f0;
      auVar198 = _DAT_01feba00;
    }
    else {
      auVar193 = sqrtps(_local_528,auVar232);
      bVar9 = 0.0 <= auVar232._0_4_;
      uVar67 = -(uint)bVar9;
      bVar65 = 0.0 <= auVar232._4_4_;
      uVar68 = -(uint)bVar65;
      bVar10 = 0.0 <= auVar232._8_4_;
      uVar69 = -(uint)bVar10;
      bVar11 = 0.0 <= auVar232._12_4_;
      uVar70 = -(uint)bVar11;
      auVar131._0_4_ = fVar161 + fVar161;
      auVar131._4_4_ = fVar163 + fVar163;
      auVar131._8_4_ = fVar174 + fVar174;
      auVar131._12_4_ = fVar175 + fVar175;
      auVar83 = rcpps(auVar196,auVar131);
      fVar214 = auVar83._0_4_;
      fVar235 = auVar83._4_4_;
      fVar258 = auVar83._8_4_;
      fVar262 = auVar83._12_4_;
      fVar214 = (1.0 - auVar131._0_4_ * fVar214) * fVar214 + fVar214;
      fVar235 = (1.0 - auVar131._4_4_ * fVar235) * fVar235 + fVar235;
      fVar258 = (1.0 - auVar131._8_4_ * fVar258) * fVar258 + fVar258;
      fVar262 = (1.0 - auVar131._12_4_ * fVar262) * fVar262 + fVar262;
      fVar234 = (-(float)local_528._0_4_ - auVar193._0_4_) * fVar214;
      fVar236 = (-(float)local_528._4_4_ - auVar193._4_4_) * fVar235;
      fVar259 = (-fStack_520 - auVar193._8_4_) * fVar258;
      fVar264 = (-fStack_51c - auVar193._12_4_) * fVar262;
      fVar214 = (auVar193._0_4_ - (float)local_528._0_4_) * fVar214;
      fVar235 = (auVar193._4_4_ - (float)local_528._4_4_) * fVar235;
      fVar258 = (auVar193._8_4_ - fStack_520) * fVar258;
      fVar262 = (auVar193._12_4_ - fStack_51c) * fVar262;
      local_368[0] = ((float)local_398._0_4_ * fVar234 + local_3b8) * local_218;
      local_368[1] = ((float)local_398._4_4_ * fVar236 + fStack_3b4) * fStack_214;
      local_368[2] = (fStack_390 * fVar259 + fStack_3b0) * fStack_210;
      local_368[3] = (fStack_38c * fVar264 + fStack_3ac) * fStack_20c;
      local_378[0] = ((float)local_398._0_4_ * fVar214 + local_3b8) * local_218;
      local_378[1] = ((float)local_398._4_4_ * fVar235 + fStack_3b4) * fStack_214;
      local_378[2] = (fStack_390 * fVar258 + fStack_3b0) * fStack_210;
      local_378[3] = (fStack_38c * fVar262 + fStack_3ac) * fStack_20c;
      auVar197._0_4_ = (uint)fVar234 & uVar67;
      auVar197._4_4_ = (uint)fVar236 & uVar68;
      auVar197._8_4_ = (uint)fVar259 & uVar69;
      auVar197._12_4_ = (uint)fVar264 & uVar70;
      auVar132._0_8_ = CONCAT44(~uVar68,~uVar67) & 0x7f8000007f800000;
      auVar132._8_4_ = ~uVar69 & 0x7f800000;
      auVar132._12_4_ = ~uVar70 & 0x7f800000;
      auVar132 = auVar132 | auVar197;
      auVar239._0_4_ = (uint)fVar214 & uVar67;
      auVar239._4_4_ = (uint)fVar235 & uVar68;
      auVar239._8_4_ = (uint)fVar258 & uVar69;
      auVar239._12_4_ = (uint)fVar262 & uVar70;
      auVar198._0_8_ = CONCAT44(~uVar68,~uVar67) & 0xff800000ff800000;
      auVar198._8_4_ = ~uVar69 & 0xff800000;
      auVar198._12_4_ = ~uVar70 & 0xff800000;
      auVar198 = auVar198 | auVar239;
      auVar240._0_8_ = CONCAT44(local_3a8._4_4_,local_3a8._0_4_) & 0x7fffffff7fffffff;
      auVar240._8_4_ = ABS(fStack_3a0);
      auVar240._12_4_ = ABS(fStack_39c);
      auVar33._4_4_ = fStack_324;
      auVar33._0_4_ = local_328;
      auVar33._8_4_ = fStack_320;
      auVar33._12_4_ = fStack_31c;
      auVar83 = maxps(auVar33,auVar240);
      fVar214 = auVar83._0_4_ * 1.9073486e-06;
      fVar234 = auVar83._4_4_ * 1.9073486e-06;
      fVar235 = auVar83._8_4_ * 1.9073486e-06;
      fVar236 = auVar83._12_4_ * 1.9073486e-06;
      auVar241._0_4_ = -(uint)(ABS(fVar161) < fVar214 && bVar9);
      auVar241._4_4_ = -(uint)(ABS(fVar163) < fVar234 && bVar65);
      auVar241._8_4_ = -(uint)(ABS(fVar174) < fVar235 && bVar10);
      auVar241._12_4_ = -(uint)(ABS(fVar175) < fVar236 && bVar11);
      iVar52 = movmskps(iVar52,auVar241);
      if (iVar52 != 0) {
        uVar67 = -(uint)(auVar196._0_4_ <= 0.0);
        uVar68 = -(uint)(auVar196._4_4_ <= 0.0);
        uVar69 = -(uint)(auVar196._8_4_ <= 0.0);
        uVar70 = -(uint)(auVar196._12_4_ <= 0.0);
        auVar282._0_4_ = (uVar67 & 0xff800000 | ~uVar67 & 0x7f800000) & auVar241._0_4_;
        auVar282._4_4_ = (uVar68 & 0xff800000 | ~uVar68 & 0x7f800000) & auVar241._4_4_;
        auVar282._8_4_ = (uVar69 & 0xff800000 | ~uVar69 & 0x7f800000) & auVar241._8_4_;
        auVar282._12_4_ = (uVar70 & 0xff800000 | ~uVar70 & 0x7f800000) & auVar241._12_4_;
        auVar208._0_4_ = ~auVar241._0_4_ & auVar132._0_4_;
        auVar208._4_4_ = ~auVar241._4_4_ & auVar132._4_4_;
        auVar208._8_4_ = ~auVar241._8_4_ & auVar132._8_4_;
        auVar208._12_4_ = ~auVar241._12_4_ & auVar132._12_4_;
        auVar181._0_4_ = (uVar67 & 0x7f800000 | ~uVar67 & 0xff800000) & auVar241._0_4_;
        auVar181._4_4_ = (uVar68 & 0x7f800000 | ~uVar68 & 0xff800000) & auVar241._4_4_;
        auVar181._8_4_ = (uVar69 & 0x7f800000 | ~uVar69 & 0xff800000) & auVar241._8_4_;
        auVar181._12_4_ = (uVar70 & 0x7f800000 | ~uVar70 & 0xff800000) & auVar241._12_4_;
        auVar242._0_4_ = ~auVar241._0_4_ & auVar198._0_4_;
        auVar242._4_4_ = ~auVar241._4_4_ & auVar198._4_4_;
        auVar242._8_4_ = ~auVar241._8_4_ & auVar198._8_4_;
        auVar242._12_4_ = ~auVar241._12_4_ & auVar198._12_4_;
        auVar180._4_4_ = -(uint)((fVar234 <= ABS(fVar163) || auVar196._4_4_ <= 0.0) && bVar65);
        auVar180._0_4_ = -(uint)((fVar214 <= ABS(fVar161) || auVar196._0_4_ <= 0.0) && bVar9);
        auVar180._8_4_ = -(uint)((fVar235 <= ABS(fVar174) || auVar196._8_4_ <= 0.0) && bVar10);
        auVar180._12_4_ = -(uint)((fVar236 <= ABS(fVar175) || auVar196._12_4_ <= 0.0) && bVar11);
        auVar132 = auVar208 | auVar282;
        auVar198 = auVar242 | auVar181;
      }
    }
    auVar182._0_4_ = (auVar180._0_4_ << 0x1f) >> 0x1f;
    auVar182._4_4_ = (auVar180._4_4_ << 0x1f) >> 0x1f;
    auVar182._8_4_ = (auVar180._8_4_ << 0x1f) >> 0x1f;
    auVar182._12_4_ = (auVar180._12_4_ << 0x1f) >> 0x1f;
    auVar182 = auVar182 & local_208;
    iVar52 = movmskps(iVar52,auVar182);
    if (iVar52 != 0) {
      auVar152._0_4_ = *(float *)(ray + k * 4 + 0x80) - (float)local_388._0_4_;
      auVar152._4_4_ = auVar152._0_4_;
      auVar152._8_4_ = auVar152._0_4_;
      auVar152._12_4_ = auVar152._0_4_;
      auVar193 = minps(auVar152,auVar198);
      auVar35._4_4_ = fStack_1f4;
      auVar35._0_4_ = local_1f8;
      auVar35._8_4_ = fStack_1f0;
      auVar35._12_4_ = fStack_1ec;
      auVar194 = maxps(auVar35,auVar132);
      auVar98._0_4_ = fVar73 * fVar279 + fVar188 * fVar190;
      auVar98._4_4_ = fVar146 * local_428 + fVar189 * local_438;
      auVar98._8_4_ = fVar147 * fStack_424 + fVar212 * fStack_434;
      auVar98._12_4_ = fVar148 * fStack_420 + fVar213 * fStack_430;
      auVar247._0_4_ = fVar275 * local_408 + fVar279 * local_498 + fVar190 * fVar72;
      auVar247._4_4_ = fVar276 * fStack_404 + local_428 * fStack_494 + local_438 * fVar72;
      auVar247._8_4_ = fVar277 * fStack_400 + fStack_424 * fStack_490 + fStack_434 * fVar72;
      auVar247._12_4_ = fVar278 * fStack_3fc + fStack_420 * fStack_48c + fStack_430 * fVar72;
      auVar83 = rcpps(auVar98,auVar247);
      fVar73 = auVar83._0_4_;
      fVar146 = auVar83._4_4_;
      fVar147 = auVar83._8_4_;
      fVar148 = auVar83._12_4_;
      fVar188 = (float)DAT_01feca10;
      fVar189 = DAT_01feca10._4_4_;
      fVar212 = DAT_01feca10._12_4_;
      fVar190 = DAT_01feca10._8_4_;
      fVar73 = ((fVar188 - auVar247._0_4_ * fVar73) * fVar73 + fVar73) *
               -(fVar244 * fVar275 + auVar98._0_4_);
      fVar146 = ((fVar189 - auVar247._4_4_ * fVar146) * fVar146 + fVar146) *
                -(fVar245 * fVar276 + auVar98._4_4_);
      fVar147 = ((fVar190 - auVar247._8_4_ * fVar147) * fVar147 + fVar147) *
                -(fVar246 * fVar277 + auVar98._8_4_);
      fVar148 = ((fVar212 - auVar247._12_4_ * fVar148) * fVar148 + fVar148) *
                -(fVar257 * fVar278 + auVar98._12_4_);
      uVar67 = -(uint)(auVar247._0_4_ < 0.0 || ABS(auVar247._0_4_) < 1e-18);
      uVar68 = -(uint)(auVar247._4_4_ < 0.0 || ABS(auVar247._4_4_) < 1e-18);
      uVar69 = -(uint)(auVar247._8_4_ < 0.0 || ABS(auVar247._8_4_) < 1e-18);
      uVar70 = -(uint)(auVar247._12_4_ < 0.0 || ABS(auVar247._12_4_) < 1e-18);
      auVar199._0_8_ = CONCAT44(uVar68,uVar67) & 0xff800000ff800000;
      auVar199._8_4_ = uVar69 & 0xff800000;
      auVar199._12_4_ = uVar70 & 0xff800000;
      auVar99._0_4_ = ~uVar67 & (uint)fVar73;
      auVar99._4_4_ = ~uVar68 & (uint)fVar146;
      auVar99._8_4_ = ~uVar69 & (uint)fVar147;
      auVar99._12_4_ = ~uVar70 & (uint)fVar148;
      auVar194 = maxps(auVar194,auVar99 | auVar199);
      uVar67 = -(uint)(0.0 < auVar247._0_4_ || ABS(auVar247._0_4_) < 1e-18);
      uVar68 = -(uint)(0.0 < auVar247._4_4_ || ABS(auVar247._4_4_) < 1e-18);
      uVar69 = -(uint)(0.0 < auVar247._8_4_ || ABS(auVar247._8_4_) < 1e-18);
      uVar70 = -(uint)(0.0 < auVar247._12_4_ || ABS(auVar247._12_4_) < 1e-18);
      auVar100._0_8_ = CONCAT44(uVar68,uVar67) & 0x7f8000007f800000;
      auVar100._8_4_ = uVar69 & 0x7f800000;
      auVar100._12_4_ = uVar70 & 0x7f800000;
      auVar248._0_4_ = ~uVar67 & (uint)fVar73;
      auVar248._4_4_ = ~uVar68 & (uint)fVar146;
      auVar248._8_4_ = ~uVar69 & (uint)fVar147;
      auVar248._12_4_ = ~uVar70 & (uint)fVar148;
      auVar193 = minps(auVar193,auVar248 | auVar100);
      auVar30._4_4_ = fStack_404;
      auVar30._0_4_ = local_408;
      auVar30._8_4_ = fStack_400;
      auVar30._12_4_ = fStack_3fc;
      auVar249._0_4_ = -fVar276 * local_408 + -local_428 * local_498 + -local_438 * fVar72;
      auVar249._4_4_ = -fVar277 * fStack_404 + -fStack_424 * fStack_494 + -fStack_434 * fVar72;
      auVar249._8_4_ = -fVar278 * fStack_400 + -fStack_420 * fStack_490 + -fStack_430 * fVar72;
      auVar249._12_4_ = fStack_3fc * -0.0 + fStack_48c * -0.0 + fVar72 * -0.0;
      auVar83 = rcpps(auVar30,auVar249);
      fVar73 = auVar83._0_4_;
      fVar146 = auVar83._4_4_;
      fVar147 = auVar83._8_4_;
      fVar148 = auVar83._12_4_;
      fVar73 = ((fVar188 - auVar249._0_4_ * fVar73) * fVar73 + fVar73) *
               -((0.0 - fVar283) * -fVar276 +
                (0.0 - fVar287) * -local_428 + (0.0 - fStack_514) * -local_438);
      fVar146 = ((fVar189 - auVar249._4_4_ * fVar146) * fVar146 + fVar146) *
                -((0.0 - fVar284) * -fVar277 +
                 (0.0 - fVar288) * -fStack_424 + (0.0 - fStack_510) * -fStack_434);
      fVar147 = ((fVar190 - auVar249._8_4_ * fVar147) * fVar147 + fVar147) *
                -((0.0 - fVar285) * -fVar278 +
                 (0.0 - fVar289) * -fStack_420 + (0.0 - fStack_50c) * -fStack_430);
      fVar148 = ((fVar212 - auVar249._12_4_ * fVar148) * fVar148 + fVar148) * 0.0;
      uVar67 = -(uint)(auVar249._0_4_ < 0.0 || ABS(auVar249._0_4_) < 1e-18);
      uVar68 = -(uint)(auVar249._4_4_ < 0.0 || ABS(auVar249._4_4_) < 1e-18);
      uVar69 = -(uint)(auVar249._8_4_ < 0.0 || ABS(auVar249._8_4_) < 1e-18);
      uVar70 = -(uint)(auVar249._12_4_ < 0.0 || ABS(auVar249._12_4_) < 1e-18);
      auVar133._0_8_ = CONCAT44(uVar68,uVar67) & 0xff800000ff800000;
      auVar133._8_4_ = uVar69 & 0xff800000;
      auVar133._12_4_ = uVar70 & 0xff800000;
      auVar101._0_4_ = ~uVar67 & (uint)fVar73;
      auVar101._4_4_ = ~uVar68 & (uint)fVar146;
      auVar101._8_4_ = ~uVar69 & (uint)fVar147;
      auVar101._12_4_ = ~uVar70 & (uint)fVar148;
      auVar83 = maxps(auVar194,auVar101 | auVar133);
      uVar67 = -(uint)(0.0 < auVar249._0_4_ || ABS(auVar249._0_4_) < 1e-18);
      uVar68 = -(uint)(0.0 < auVar249._4_4_ || ABS(auVar249._4_4_) < 1e-18);
      uVar69 = -(uint)(0.0 < auVar249._8_4_ || ABS(auVar249._8_4_) < 1e-18);
      uVar70 = -(uint)(0.0 < auVar249._12_4_ || ABS(auVar249._12_4_) < 1e-18);
      auVar102._0_8_ = CONCAT44(uVar68,uVar67) & 0x7f8000007f800000;
      auVar102._8_4_ = uVar69 & 0x7f800000;
      auVar102._12_4_ = uVar70 & 0x7f800000;
      auVar250._0_4_ = ~uVar67 & (uint)fVar73;
      auVar250._4_4_ = ~uVar68 & (uint)fVar146;
      auVar250._8_4_ = ~uVar69 & (uint)fVar147;
      auVar250._12_4_ = ~uVar70 & (uint)fVar148;
      local_238 = minps(auVar193,auVar250 | auVar102);
      fVar148 = auVar83._12_4_;
      fVar73 = auVar83._0_4_;
      fVar146 = auVar83._4_4_;
      fVar147 = auVar83._8_4_;
      auVar166._0_4_ = -(uint)(fVar73 <= local_238._0_4_) & auVar182._0_4_;
      auVar166._4_4_ = -(uint)(fVar146 <= local_238._4_4_) & auVar182._4_4_;
      auVar166._8_4_ = -(uint)(fVar147 <= local_238._8_4_) & auVar182._8_4_;
      auVar166._12_4_ = -(uint)(fVar148 <= local_238._12_4_) & auVar182._12_4_;
      iVar52 = movmskps(iVar52,auVar166);
      if (iVar52 != 0) {
        auVar27._4_4_ = fStack_464;
        auVar27._0_4_ = local_468;
        auVar27._8_4_ = fStack_460;
        auVar27._12_4_ = fStack_45c;
        auVar193 = maxps(ZEXT816(0),auVar27);
        auVar32._4_4_ = local_368[1];
        auVar32._0_4_ = local_368[0];
        auVar32._8_4_ = local_368[2];
        auVar32._12_4_ = local_368[3];
        auVar194 = minps(auVar32,_DAT_01feca10);
        fVar213 = 0.0;
        fVar214 = 0.0;
        fVar234 = 0.0;
        fVar235 = 0.0;
        auVar194 = maxps(auVar194,ZEXT816(0));
        auVar31._4_4_ = local_378[1];
        auVar31._0_4_ = local_378[0];
        auVar31._8_4_ = local_378[2];
        auVar31._12_4_ = local_378[3];
        auVar231 = minps(auVar31,_DAT_01feca10);
        auVar231 = maxps(auVar231,ZEXT816(0));
        auVar28._4_4_ = local_448;
        auVar28._0_4_ = local_448;
        auVar28._8_4_ = local_448;
        auVar28._12_4_ = local_448;
        local_368[0] = (auVar194._0_4_ + 0.0) * 0.25 * local_448 + local_4a8;
        local_368[1] = (auVar194._4_4_ + 1.0) * 0.25 * local_448 + local_4a8;
        local_368[2] = (auVar194._8_4_ + 2.0) * 0.25 * local_448 + local_4a8;
        local_368[3] = (auVar194._12_4_ + 3.0) * 0.25 * local_448 + local_4a8;
        local_378[0] = (auVar231._0_4_ + 0.0) * 0.25 * local_448 + local_4a8;
        local_378[1] = (auVar231._4_4_ + 1.0) * 0.25 * local_448 + local_4a8;
        local_378[2] = (auVar231._8_4_ + 2.0) * 0.25 * local_448 + local_4a8;
        local_378[3] = (auVar231._12_4_ + 3.0) * 0.25 * local_448 + local_4a8;
        auVar134._0_4_ = fVar200 - auVar193._0_4_ * auVar193._0_4_;
        auVar134._4_4_ = fVar201 - auVar193._4_4_ * auVar193._4_4_;
        auVar134._8_4_ = fVar202 - auVar193._8_4_ * auVar193._8_4_;
        auVar134._12_4_ = fVar176 - auVar193._12_4_ * auVar193._12_4_;
        auVar233._0_4_ =
             (float)local_528._0_4_ * (float)local_528._0_4_ -
             (float)local_4d8._0_4_ * auVar134._0_4_;
        auVar233._4_4_ =
             (float)local_528._4_4_ * (float)local_528._4_4_ -
             (float)local_4d8._4_4_ * auVar134._4_4_;
        auVar233._8_4_ = fStack_520 * fStack_520 - fStack_4d0 * auVar134._8_4_;
        auVar233._12_4_ = fStack_51c * fStack_51c - fStack_4cc * auVar134._12_4_;
        local_4d8._4_4_ = -(uint)(0.0 <= auVar233._4_4_);
        local_4d8._0_4_ = -(uint)(0.0 <= auVar233._0_4_);
        fStack_4d0 = (float)-(uint)(0.0 <= auVar233._8_4_);
        fStack_4cc = (float)-(uint)(0.0 <= auVar233._12_4_);
        iVar52 = movmskps(iVar52,_local_4d8);
        if (iVar52 == 0) {
          fVar257 = 0.0;
          fVar258 = 0.0;
          fVar259 = 0.0;
          fVar262 = 0.0;
          fVar236 = 0.0;
          fVar244 = 0.0;
          fVar245 = 0.0;
          fVar246 = 0.0;
          fVar200 = 0.0;
          fVar202 = 0.0;
          fVar188 = 0.0;
          fVar212 = 0.0;
          fVar190 = 0.0;
          fVar201 = 0.0;
          fVar176 = 0.0;
          fVar189 = 0.0;
          _local_528 = ZEXT816(0);
          iVar52 = 0;
          auVar135 = _DAT_01feba00;
          auVar243 = _DAT_01feb9f0;
        }
        else {
          auVar194 = sqrtps(auVar28,auVar233);
          auVar103._0_4_ = fVar161 + fVar161;
          auVar103._4_4_ = fVar163 + fVar163;
          auVar103._8_4_ = fVar174 + fVar174;
          auVar103._12_4_ = fVar175 + fVar175;
          auVar193 = rcpps(auVar134,auVar103);
          fVar264 = auVar193._0_4_;
          fVar267 = auVar193._4_4_;
          fVar273 = auVar193._8_4_;
          fVar274 = auVar193._12_4_;
          fVar264 = (fVar188 - auVar103._0_4_ * fVar264) * fVar264 + fVar264;
          fVar267 = (fVar189 - auVar103._4_4_ * fVar267) * fVar267 + fVar267;
          fVar273 = (fVar190 - auVar103._8_4_ * fVar273) * fVar273 + fVar273;
          fVar274 = (fVar212 - auVar103._12_4_ * fVar274) * fVar274 + fVar274;
          fVar275 = (-(float)local_528._0_4_ - auVar194._0_4_) * fVar264;
          fVar276 = (-(float)local_528._4_4_ - auVar194._4_4_) * fVar267;
          fVar277 = (-fStack_520 - auVar194._8_4_) * fVar273;
          fVar278 = (-fStack_51c - auVar194._12_4_) * fVar274;
          fVar264 = (auVar194._0_4_ - (float)local_528._0_4_) * fVar264;
          fVar267 = (auVar194._4_4_ - (float)local_528._4_4_) * fVar267;
          fVar273 = (auVar194._8_4_ - fStack_520) * fVar273;
          fVar274 = (auVar194._12_4_ - fStack_51c) * fVar274;
          fVar213 = ((float)local_398._0_4_ * fVar275 + local_3b8) * local_218;
          fVar214 = ((float)local_398._4_4_ * fVar276 + fStack_3b4) * fStack_214;
          fVar234 = (fStack_390 * fVar277 + fStack_3b0) * fStack_210;
          fVar235 = (fStack_38c * fVar278 + fStack_3ac) * fStack_20c;
          fVar200 = local_408 * fVar275 - ((float)local_4c8._0_4_ * fVar213 + fVar280);
          fVar202 = fStack_404 * fVar276 - ((float)local_4c8._4_4_ * fVar214 + fVar283);
          fVar188 = fStack_400 * fVar277 - (fStack_4c0 * fVar234 + fVar284);
          fVar212 = fStack_3fc * fVar278 - (fStack_4bc * fVar235 + fVar285);
          fVar190 = local_498 * fVar275 - (local_488 * fVar213 + fVar286);
          fVar201 = fStack_494 * fVar276 - (fStack_484 * fVar214 + fVar287);
          fVar176 = fStack_490 * fVar277 - (fStack_480 * fVar234 + fVar288);
          fVar189 = fStack_48c * fVar278 - (fStack_47c * fVar235 + fVar289);
          local_528._4_4_ = fVar72 * fVar276 - (fVar214 * (float)local_4b8._4_4_ + fStack_514);
          local_528._0_4_ = fVar72 * fVar275 - (fVar213 * (float)local_4b8._0_4_ + local_518);
          fStack_520 = fVar72 * fVar277 - (fVar234 * fStack_4b0 + fStack_510);
          fStack_51c = fVar72 * fVar278 - (fVar235 * fStack_4ac + fStack_50c);
          fVar236 = ((float)local_398._0_4_ * fVar264 + local_3b8) * local_218;
          fVar244 = ((float)local_398._4_4_ * fVar267 + fStack_3b4) * fStack_214;
          fVar245 = (fStack_390 * fVar273 + fStack_3b0) * fStack_210;
          fVar246 = (fStack_38c * fVar274 + fStack_3ac) * fStack_20c;
          fVar213 = local_408 * fVar264 - ((float)local_4c8._0_4_ * fVar236 + fVar280);
          fVar214 = fStack_404 * fVar267 - ((float)local_4c8._4_4_ * fVar244 + fVar283);
          fVar234 = fStack_400 * fVar273 - (fStack_4c0 * fVar245 + fVar284);
          fVar235 = fStack_3fc * fVar274 - (fStack_4bc * fVar246 + fVar285);
          fVar257 = local_498 * fVar264 - (local_488 * fVar236 + fVar286);
          fVar258 = fStack_494 * fVar267 - (fStack_484 * fVar244 + fVar287);
          fVar259 = fStack_490 * fVar273 - (fStack_480 * fVar245 + fVar288);
          fVar262 = fStack_48c * fVar274 - (fStack_47c * fVar246 + fVar289);
          bVar9 = 0.0 <= auVar233._0_4_;
          uVar67 = -(uint)bVar9;
          bVar65 = 0.0 <= auVar233._4_4_;
          uVar68 = -(uint)bVar65;
          bVar10 = 0.0 <= auVar233._8_4_;
          uVar69 = -(uint)bVar10;
          bVar11 = 0.0 <= auVar233._12_4_;
          uVar70 = -(uint)bVar11;
          fVar236 = fVar72 * fVar264 - (fVar236 * (float)local_4b8._0_4_ + local_518);
          fVar244 = fVar72 * fVar267 - (fVar244 * (float)local_4b8._4_4_ + fStack_514);
          fVar245 = fVar72 * fVar273 - (fVar245 * fStack_4b0 + fStack_510);
          fVar246 = fVar72 * fVar274 - (fVar246 * fStack_4ac + fStack_50c);
          auVar251._0_4_ = (uint)fVar275 & uVar67;
          auVar251._4_4_ = (uint)fVar276 & uVar68;
          auVar251._8_4_ = (uint)fVar277 & uVar69;
          auVar251._12_4_ = (uint)fVar278 & uVar70;
          auVar243._0_8_ = CONCAT44(~uVar68,~uVar67) & 0x7f8000007f800000;
          auVar243._8_4_ = ~uVar69 & 0x7f800000;
          auVar243._12_4_ = ~uVar70 & 0x7f800000;
          auVar243 = auVar243 | auVar251;
          auVar209._0_4_ = (uint)fVar264 & uVar67;
          auVar209._4_4_ = (uint)fVar267 & uVar68;
          auVar209._8_4_ = (uint)fVar273 & uVar69;
          auVar209._12_4_ = (uint)fVar274 & uVar70;
          auVar135._0_8_ = CONCAT44(~uVar68,~uVar67) & 0xff800000ff800000;
          auVar135._8_4_ = ~uVar69 & 0xff800000;
          auVar135._12_4_ = ~uVar70 & 0xff800000;
          auVar135 = auVar135 | auVar209;
          auVar104._0_8_ = (ulong)local_3a8 & 0x7fffffff7fffffff;
          auVar104._8_4_ = ABS(fStack_3a0);
          auVar104._12_4_ = ABS(fStack_39c);
          auVar34._4_4_ = fStack_324;
          auVar34._0_4_ = local_328;
          auVar34._8_4_ = fStack_320;
          auVar34._12_4_ = fStack_31c;
          auVar193 = maxps(auVar34,auVar104);
          fVar264 = auVar193._0_4_ * 1.9073486e-06;
          fVar267 = auVar193._4_4_ * 1.9073486e-06;
          fVar273 = auVar193._8_4_ * 1.9073486e-06;
          fVar274 = auVar193._12_4_ * 1.9073486e-06;
          auVar210._0_4_ = -(uint)(ABS(fVar161) < fVar264 && bVar9);
          auVar210._4_4_ = -(uint)(ABS(fVar163) < fVar267 && bVar65);
          auVar210._8_4_ = -(uint)(ABS(fVar174) < fVar273 && bVar10);
          auVar210._12_4_ = -(uint)(ABS(fVar175) < fVar274 && bVar11);
          iVar52 = movmskps(iVar52,auVar210);
          if (iVar52 != 0) {
            uVar67 = -(uint)(auVar134._0_4_ <= 0.0);
            uVar68 = -(uint)(auVar134._4_4_ <= 0.0);
            uVar69 = -(uint)(auVar134._8_4_ <= 0.0);
            uVar70 = -(uint)(auVar134._12_4_ <= 0.0);
            auVar260._0_4_ = (uVar67 & 0xff800000 | ~uVar67 & 0x7f800000) & auVar210._0_4_;
            auVar260._4_4_ = (uVar68 & 0xff800000 | ~uVar68 & 0x7f800000) & auVar210._4_4_;
            auVar260._8_4_ = (uVar69 & 0xff800000 | ~uVar69 & 0x7f800000) & auVar210._8_4_;
            auVar260._12_4_ = (uVar70 & 0xff800000 | ~uVar70 & 0x7f800000) & auVar210._12_4_;
            auVar256._0_4_ = ~auVar210._0_4_ & auVar243._0_4_;
            auVar256._4_4_ = ~auVar210._4_4_ & auVar243._4_4_;
            auVar256._8_4_ = ~auVar210._8_4_ & auVar243._8_4_;
            auVar256._12_4_ = ~auVar210._12_4_ & auVar243._12_4_;
            auVar243 = auVar256 | auVar260;
            auVar261._0_4_ = (uVar67 & 0x7f800000 | ~uVar67 & 0xff800000) & auVar210._0_4_;
            auVar261._4_4_ = (uVar68 & 0x7f800000 | ~uVar68 & 0xff800000) & auVar210._4_4_;
            auVar261._8_4_ = (uVar69 & 0x7f800000 | ~uVar69 & 0xff800000) & auVar210._8_4_;
            auVar261._12_4_ = (uVar70 & 0x7f800000 | ~uVar70 & 0xff800000) & auVar210._12_4_;
            auVar211._0_4_ = ~auVar210._0_4_ & auVar135._0_4_;
            auVar211._4_4_ = ~auVar210._4_4_ & auVar135._4_4_;
            auVar211._8_4_ = ~auVar210._8_4_ & auVar135._8_4_;
            auVar211._12_4_ = ~auVar210._12_4_ & auVar135._12_4_;
            auVar135 = auVar211 | auVar261;
            local_4d8._4_4_ = -(uint)((fVar267 <= ABS(fVar163) || auVar134._4_4_ <= 0.0) && bVar65);
            local_4d8._0_4_ = -(uint)((fVar264 <= ABS(fVar161) || auVar134._0_4_ <= 0.0) && bVar9);
            fStack_4d0 = (float)-(uint)((fVar273 <= ABS(fVar174) || auVar134._8_4_ <= 0.0) && bVar10
                                       );
            fStack_4cc = (float)-(uint)((fVar274 <= ABS(fVar175) || auVar134._12_4_ <= 0.0) &&
                                       bVar11);
          }
        }
        local_4b8._4_4_ =
             -(uint)(0.3 <= ABS(fVar214 * fStack_404 + fVar258 * fStack_494 + fVar244 * fVar72));
        local_4b8._0_4_ =
             -(uint)(0.3 <= ABS(fVar213 * local_408 + fVar257 * local_498 + fVar236 * fVar72));
        fStack_4b0 = (float)-(uint)(0.3 <= ABS(fVar234 * fStack_400 +
                                               fVar259 * fStack_490 + fVar245 * fVar72));
        fStack_4ac = (float)-(uint)(0.3 <= ABS(fVar235 * fStack_3fc +
                                               fVar262 * fStack_48c + fVar246 * fVar72));
        _local_118 = auVar83;
        local_108 = minps(local_238,auVar243);
        _local_248 = maxps(auVar83,auVar135);
        local_3a8._0_4_ = -(uint)(fVar73 <= local_108._0_4_) & auVar166._0_4_;
        local_3a8._4_4_ = -(uint)(fVar146 <= local_108._4_4_) & auVar166._4_4_;
        fStack_3a0 = (float)(-(uint)(fVar147 <= local_108._8_4_) & auVar166._8_4_);
        fStack_39c = (float)(-(uint)(fVar148 <= local_108._12_4_) & auVar166._12_4_);
        local_3c8 = _local_3a8;
        _local_4c8 = _local_248;
        local_3d8._0_4_ = -(uint)(local_248._0_4_ <= local_238._0_4_) & auVar166._0_4_;
        local_3d8._4_4_ = -(uint)(local_248._4_4_ <= local_238._4_4_) & auVar166._4_4_;
        local_3d8._8_4_ = -(uint)(local_248._8_4_ <= local_238._8_4_) & auVar166._8_4_;
        local_3d8._12_4_ = -(uint)(local_248._12_4_ <= local_238._12_4_) & auVar166._12_4_;
        _local_398 = local_3d8;
        iVar52 = movmskps(iVar52,local_3d8 | _local_3a8);
        if (iVar52 != 0) {
          local_3b8 = (float)(int)local_560;
          fStack_3b4 = (float)(int)local_560;
          fStack_3b0 = (float)(int)local_560;
          fStack_3ac = (float)(int)local_560;
          local_528._0_4_ =
               -(uint)((int)local_560 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_528._0_4_ * fVar72 +
                                                 fVar190 * local_498 + fVar200 * local_408)) &
                             local_4d8._0_4_) << 0x1f) >> 0x1f) + 4);
          local_528._4_4_ =
               -(uint)((int)local_560 <
                      ((int)((-(uint)(0.3 <= ABS((float)local_528._4_4_ * fVar72 +
                                                 fVar201 * fStack_494 + fVar202 * fStack_404)) &
                             local_4d8._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_520 = (float)-(uint)((int)local_560 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_520 * fVar72 +
                                                                fVar176 * fStack_490 +
                                                                fVar188 * fStack_400)) &
                                            (uint)fStack_4d0) << 0x1f) >> 0x1f) + 4);
          fStack_51c = (float)-(uint)((int)local_560 <
                                     ((int)((-(uint)(0.3 <= ABS(fStack_51c * fVar72 +
                                                                fVar189 * fStack_48c +
                                                                fVar212 * fStack_3fc)) &
                                            (uint)fStack_4cc) << 0x1f) >> 0x1f) + 4);
          local_3c8 = ~_local_528 & _local_3a8;
          iVar52 = movmskps(iVar52,local_3c8);
          if (iVar52 != 0) {
            local_488 = local_478 + fVar73;
            fStack_484 = fStack_474 + fVar146;
            fStack_480 = fStack_470 + fVar147;
            fStack_47c = fStack_46c + fVar148;
            do {
              auVar194 = ~local_3c8 & _DAT_01feb9f0 | local_3c8 & auVar83;
              auVar167._4_4_ = auVar194._0_4_;
              auVar167._0_4_ = auVar194._4_4_;
              auVar167._8_4_ = auVar194._12_4_;
              auVar167._12_4_ = auVar194._8_4_;
              auVar193 = minps(auVar167,auVar194);
              auVar136._0_8_ = auVar193._8_8_;
              auVar136._8_4_ = auVar193._0_4_;
              auVar136._12_4_ = auVar193._4_4_;
              auVar193 = minps(auVar136,auVar193);
              auVar137._0_8_ =
                   CONCAT44(-(uint)(auVar193._4_4_ == auVar194._4_4_) & local_3c8._4_4_,
                            -(uint)(auVar193._0_4_ == auVar194._0_4_) & local_3c8._0_4_);
              auVar137._8_4_ = -(uint)(auVar193._8_4_ == auVar194._8_4_) & local_3c8._8_4_;
              auVar137._12_4_ = -(uint)(auVar193._12_4_ == auVar194._12_4_) & local_3c8._12_4_;
              iVar52 = movmskps(iVar52,auVar137);
              auVar105 = local_3c8;
              if (iVar52 != 0) {
                auVar105._8_4_ = auVar137._8_4_;
                auVar105._0_8_ = auVar137._0_8_;
                auVar105._12_4_ = auVar137._12_4_;
              }
              uVar53 = movmskps(iVar52,auVar105);
              uVar56 = 0;
              if (CONCAT44(uVar61,uVar53) != 0) {
                for (; (CONCAT44(uVar61,uVar53) >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
                }
              }
              *(undefined4 *)(local_3c8 + uVar56 * 4) = 0;
              fVar73 = local_368[uVar56];
              fVar146 = *(float *)(local_118 + uVar56 * 4);
              fVar147 = SQRT(fVar122);
              if ((float)local_3f8._0_4_ < 0.0) {
                fVar147 = sqrtf((float)local_3f8._0_4_);
                uVar56 = extraout_RAX;
              }
              auVar19._4_4_ = fVar119;
              auVar19._0_4_ = fVar118;
              auVar19._8_4_ = fVar120;
              auVar19._12_4_ = fVar121;
              auVar25._4_4_ = fStack_4e4;
              auVar25._0_4_ = local_4e8;
              auVar25._8_4_ = fStack_4e0;
              auVar25._12_4_ = fStack_4dc;
              auVar194 = minps(auVar19,auVar25);
              auVar231 = maxps(auVar19,auVar25);
              auVar23._4_4_ = fStack_4f4;
              auVar23._0_4_ = local_4f8;
              auVar23._8_4_ = fStack_4f0;
              auVar23._12_4_ = fStack_4ec;
              auVar21._4_4_ = fStack_504;
              auVar21._0_4_ = local_508;
              auVar21._8_4_ = fStack_500;
              auVar21._12_4_ = fStack_4fc;
              auVar193 = minps(auVar23,auVar21);
              auVar194 = minps(auVar194,auVar193);
              auVar193 = maxps(auVar23,auVar21);
              auVar193 = maxps(auVar231,auVar193);
              auVar183._0_8_ = auVar194._0_8_ & 0x7fffffff7fffffff;
              auVar183._8_4_ = auVar194._8_4_ & 0x7fffffff;
              auVar183._12_4_ = auVar194._12_4_ & 0x7fffffff;
              local_468 = auVar193._12_4_;
              auVar106._0_8_ = auVar193._0_8_ & 0x7fffffff7fffffff;
              auVar106._8_4_ = auVar193._8_4_ & 0x7fffffff;
              auVar106._12_4_ = ABS(local_468);
              auVar193 = maxps(auVar183,auVar106);
              fVar148 = auVar193._4_4_;
              if (auVar193._4_4_ <= auVar193._0_4_) {
                fVar148 = auVar193._0_4_;
              }
              auVar184._8_8_ = auVar193._8_8_;
              auVar184._0_8_ = auVar193._8_8_;
              if (auVar193._8_4_ <= fVar148) {
                auVar184._0_4_ = fVar148;
              }
              fVar148 = auVar184._0_4_ * 1.9073486e-06;
              local_428 = fVar147 * 1.9073486e-06;
              fStack_464 = local_468;
              fStack_460 = local_468;
              fStack_45c = local_468;
              lVar54 = 4;
              do {
                fVar212 = 1.0 - fVar73;
                fVar175 = local_4e8 * fVar212 + local_4f8 * fVar73;
                fVar190 = fStack_4e4 * fVar212 + fStack_4f4 * fVar73;
                fVar200 = fStack_4e0 * fVar212 + fStack_4f0 * fVar73;
                fVar202 = fStack_4dc * fVar212 + fStack_4ec * fVar73;
                fVar147 = (fVar118 * fVar212 + local_4e8 * fVar73) * fVar212 + fVar73 * fVar175;
                fVar161 = (fVar119 * fVar212 + fStack_4e4 * fVar73) * fVar212 + fVar73 * fVar190;
                fVar163 = (fVar120 * fVar212 + fStack_4e0 * fVar73) * fVar212 + fVar73 * fVar200;
                fVar174 = (fVar121 * fVar212 + fStack_4dc * fVar73) * fVar212 + fVar73 * fVar202;
                fVar175 = fVar175 * fVar212 + (local_4f8 * fVar212 + local_508 * fVar73) * fVar73;
                fVar201 = fVar190 * fVar212 + (fStack_4f4 * fVar212 + fStack_504 * fVar73) * fVar73;
                fVar176 = fVar200 * fVar212 + (fStack_4f0 * fVar212 + fStack_500 * fVar73) * fVar73;
                fVar189 = fVar202 * fVar212 + (fStack_4ec * fVar212 + fStack_4fc * fVar73) * fVar73;
                fVar190 = fVar212 * fVar174 + fVar73 * fVar189;
                fVar200 = (fVar175 - fVar147) * 3.0;
                fVar202 = (fVar201 - fVar161) * 3.0;
                fVar188 = (fVar176 - fVar163) * 3.0;
                fVar189 = (fVar189 - fVar174) * 3.0;
                fVar174 = (fVar146 * (float)local_3e8._0_4_ + 0.0) -
                          (fVar212 * fVar147 + fVar73 * fVar175);
                fVar175 = (fVar146 * (float)local_3e8._4_4_ + 0.0) -
                          (fVar212 * fVar161 + fVar73 * fVar201);
                fVar163 = (fVar146 * fStack_3e0 + 0.0) - (fVar212 * fVar163 + fVar73 * fVar176);
                fVar161 = (fVar146 * fStack_3dc + 0.0) - fVar190;
                fVar147 = fVar175 * fVar175;
                fStack_630 = fVar163 * fVar163;
                fStack_62c = fVar161 * fVar161;
                local_638._0_4_ = fVar147 + fVar174 * fVar174 + fStack_630;
                local_638._4_4_ = fVar147 + fVar147 + fStack_62c;
                fStack_630 = fVar147 + fStack_630 + fStack_630;
                fStack_62c = fVar147 + fStack_62c + fStack_62c;
                local_438 = (float)local_638._0_4_;
                if ((float)local_638._0_4_ < 0.0) {
                  fVar147 = sqrtf((float)local_638._0_4_);
                  uVar55 = extraout_RAX_00;
                }
                else {
                  fVar147 = SQRT((float)local_638._0_4_);
                  uVar55 = uVar56;
                }
                fVar213 = fVar212 * 6.0;
                fVar201 = (fVar73 - (fVar212 + fVar212)) * 6.0;
                fVar212 = (fVar212 - (fVar73 + fVar73)) * 6.0;
                fVar176 = fVar73 * 6.0;
                fVar214 = fVar213 * fVar118 +
                          fVar201 * local_4e8 + fVar212 * local_4f8 + fVar176 * local_508;
                fVar234 = fVar213 * fVar119 +
                          fVar201 * fStack_4e4 + fVar212 * fStack_4f4 + fVar176 * fStack_504;
                fVar176 = fVar213 * fVar120 +
                          fVar201 * fStack_4e0 + fVar212 * fStack_4f0 + fVar176 * fStack_500;
                fVar201 = fVar148;
                if (fVar148 <= local_428 * fVar146) {
                  fVar201 = local_428 * fVar146;
                }
                fVar212 = fVar202 * fVar202 + fVar200 * fVar200 + fVar188 * fVar188;
                auVar194 = ZEXT416((uint)fVar212);
                auVar193 = rsqrtss(ZEXT416((uint)fVar212),auVar194);
                fVar213 = auVar193._0_4_;
                fVar213 = fVar213 * fVar213 * fVar212 * -0.5 * fVar213 + fVar213 * 1.5;
                fVar235 = fVar188 * fVar176 + fVar202 * fVar234 + fVar200 * fVar214;
                auVar193 = rcpss(auVar194,auVar194);
                fVar236 = (2.0 - fVar212 * auVar193._0_4_) * auVar193._0_4_;
                fVar244 = fVar200 * fVar213;
                fVar245 = fVar202 * fVar213;
                fVar246 = fVar188 * fVar213;
                fVar257 = fVar189 * fVar213;
                local_5f8._0_4_ = -fVar200;
                local_5f8._4_4_ = -fVar202;
                if (fVar212 < 0.0) {
                  local_5f8 = CONCAT44(fVar202,fVar200) ^ 0x8000000080000000;
                  fVar258 = sqrtf(fVar212);
                  uVar55 = extraout_RAX_01;
                }
                else {
                  fVar258 = SQRT(fVar212);
                }
                fVar259 = fVar175 * fVar245;
                fVar262 = fVar163 * fVar246;
                fVar264 = fVar161 * fVar257;
                fVar267 = fVar259 + fVar174 * fVar244 + fVar262;
                fVar273 = fVar259 + fVar259 + fVar264;
                fVar262 = fVar259 + fVar262 + fVar262;
                fVar264 = fVar259 + fVar264 + fVar264;
                fVar259 = (fVar147 + 1.0) * (fVar148 / fVar258) + fVar147 * fVar148 + fVar201;
                fVar258 = fStack_3dc * fVar257;
                fVar235 = fVar246 * -fVar188 +
                          fVar245 * local_5f8._4_4_ + fVar244 * (float)local_5f8 +
                          fVar236 * (fVar212 * fVar176 - fVar235 * fVar188) * fVar213 * fVar163 +
                          fVar236 * (fVar212 * fVar234 - fVar235 * fVar202) * fVar213 * fVar175 +
                          fVar236 * (fVar212 * fVar214 - fVar235 * fVar200) * fVar213 * fVar174;
                fVar147 = fStack_3e0 * fVar246 +
                          (float)local_3e8._4_4_ * fVar245 + (float)local_3e8._0_4_ * fVar244;
                fVar176 = (float)local_638._0_4_ - fVar267 * fVar267;
                auVar107._0_8_ = CONCAT44((float)local_638._4_4_ - fVar273 * fVar273,fVar176);
                auVar107._8_4_ = fStack_630 - fVar262 * fVar262;
                auVar107._12_4_ = fStack_62c - fVar264 * fVar264;
                fVar234 = -fVar189 * fVar161;
                fVar213 = fStack_3e0 * fVar163;
                fVar161 = fStack_3dc * fVar161;
                fVar212 = (fVar213 +
                          (float)local_3e8._4_4_ * fVar175 + (float)local_3e8._0_4_ * fVar174) -
                          fVar267 * fVar147;
                auVar168._8_4_ = auVar107._8_4_;
                auVar168._0_8_ = auVar107._0_8_;
                auVar168._12_4_ = auVar107._12_4_;
                auVar193 = rsqrtss(auVar168,auVar107);
                fVar214 = auVar193._0_4_;
                auVar169._4_12_ = auVar193._4_12_;
                auVar169._0_4_ = fVar214 * fVar214 * fVar176 * -0.5 * fVar214 + fVar214 * 1.5;
                if (fVar176 < 0.0) {
                  local_518 = fVar267;
                  fStack_514 = fVar273;
                  fStack_510 = fVar262;
                  fStack_50c = fVar264;
                  _local_458 = auVar169;
                  local_448 = fVar147;
                  fStack_444 = fVar258;
                  fStack_440 = fStack_3e0 * fVar246;
                  fStack_43c = fVar258;
                  fVar176 = sqrtf(fVar176);
                  uVar55 = extraout_RAX_02;
                  auVar169 = _local_458;
                  fVar214 = local_518;
                  fVar147 = local_448;
                  fVar258 = fStack_444;
                }
                else {
                  fVar176 = SQRT(fVar176);
                  fVar214 = fVar267;
                }
                fVar176 = fVar176 - fVar190;
                fVar190 = ((-fVar188 * fVar163 +
                           local_5f8._4_4_ * fVar175 + (float)local_5f8 * fVar174) -
                          fVar267 * fVar235) * auVar169._0_4_ - fVar189;
                auVar18._4_4_ = fVar161;
                auVar18._0_4_ = fVar212;
                auVar18._8_4_ = fVar213;
                auVar18._12_4_ = fVar161;
                auVar153._4_12_ = auVar18._4_12_;
                auVar153._0_4_ = fVar212 * auVar169._0_4_;
                auVar253._0_8_ = CONCAT44(fVar234,fVar190) ^ 0x8000000080000000;
                auVar253._8_4_ = -fVar234;
                auVar253._12_4_ = fVar257 * -fVar189;
                auVar252._8_8_ = auVar253._8_8_;
                auVar252._0_8_ = CONCAT44(fVar235,fVar190) ^ 0x80000000;
                fVar190 = fVar235 * auVar153._0_4_ - fVar147 * fVar190;
                auVar155._0_8_ = auVar153._0_8_;
                auVar155._8_4_ = fVar161;
                auVar155._12_4_ = -fVar258;
                auVar154._8_8_ = auVar155._8_8_;
                auVar154._0_8_ = CONCAT44(fVar147,auVar153._0_4_) ^ 0x8000000000000000;
                auVar12._4_4_ = fVar190;
                auVar12._0_4_ = fVar190;
                auVar12._8_4_ = fVar190;
                auVar12._12_4_ = fVar190;
                auVar193 = divps(auVar154,auVar12);
                auVar13._4_4_ = fVar190;
                auVar13._0_4_ = fVar190;
                auVar13._8_4_ = fVar190;
                auVar13._12_4_ = fVar190;
                auVar194 = divps(auVar252,auVar13);
                fVar73 = fVar73 - (auVar193._4_4_ * fVar176 + auVar193._0_4_ * fVar214);
                fVar146 = fVar146 - (auVar194._4_4_ * fVar176 + auVar194._0_4_ * fVar214);
                if (fVar259 <= ABS(fVar214)) {
                  bVar9 = false;
                }
                else if (local_468 * 1.9073486e-06 + fVar201 + fVar259 <= ABS(fVar176)) {
                  bVar9 = false;
                }
                else {
                  fVar146 = fVar146 + (float)local_388._0_4_;
                  bVar9 = true;
                  if ((((fVar162 <= fVar146) &&
                       (fVar147 = *(float *)(ray + k * 4 + 0x80), fVar146 <= fVar147)) &&
                      (0.0 <= fVar73)) && (fVar73 <= 1.0)) {
                    auVar193 = rsqrtss(_local_638,_local_638);
                    fVar161 = auVar193._0_4_;
                    pGVar7 = (context->scene->geometries).items[uVar63].ptr;
                    uVar55 = (ulong)*(uint *)(ray + k * 4 + 0x90);
                    pRVar62 = (RTCIntersectArguments *)context;
                    if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar161 = fVar161 * 1.5 + fVar161 * fVar161 * local_438 * -0.5 * fVar161;
                      fVar174 = fVar174 * fVar161;
                      fVar175 = fVar175 * fVar161;
                      fVar163 = fVar163 * fVar161;
                      fVar190 = fVar189 * fVar174 + fVar200;
                      fVar201 = fVar189 * fVar175 + fVar202;
                      fVar176 = fVar189 * fVar163 + fVar188;
                      fVar189 = fVar175 * fVar200 - fVar202 * fVar174;
                      fVar175 = fVar163 * fVar202 - fVar188 * fVar175;
                      fVar163 = fVar174 * fVar188 - fVar200 * fVar163;
                      fVar161 = fVar201 * fVar175 - fVar163 * fVar190;
                      fVar163 = fVar176 * fVar163 - fVar189 * fVar201;
                      fVar174 = fVar190 * fVar189 - fVar175 * fVar176;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar146;
                        *(float *)(ray + k * 4 + 0xc0) = fVar163;
                        *(float *)(ray + k * 4 + 0xd0) = fVar174;
                        *(float *)(ray + k * 4 + 0xe0) = fVar161;
                        *(float *)(ray + k * 4 + 0xf0) = fVar73;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(undefined4 *)(ray + k * 4 + 0x110) = uVar6;
                        *(uint *)(ray + k * 4 + 0x120) = uVar66;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        uVar67 = context->user->instPrimID[0];
                        uVar55 = (ulong)uVar67;
                        *(uint *)(ray + k * 4 + 0x140) = uVar67;
                      }
                      else {
                        local_2d8._4_4_ = fVar163;
                        local_2d8._0_4_ = fVar163;
                        local_2d8._8_4_ = fVar163;
                        fStack_2cc = fVar163;
                        local_2c8 = fVar174;
                        fStack_2c4 = fVar174;
                        fStack_2c0 = fVar174;
                        fStack_2bc = fVar174;
                        local_2b8 = fVar161;
                        fStack_2b4 = fVar161;
                        fStack_2b0 = fVar161;
                        fStack_2ac = fVar161;
                        local_2a8 = fVar73;
                        fStack_2a4 = fVar73;
                        fStack_2a0 = fVar73;
                        fStack_29c = fVar73;
                        local_298 = 0;
                        uStack_290 = 0;
                        local_288 = CONCAT44(uStack_344,local_348);
                        uStack_280 = CONCAT44(uStack_33c,uStack_340);
                        local_278 = CONCAT44(uStack_334,local_338);
                        uStack_270 = CONCAT44(uStack_32c,uStack_330);
                        local_268 = context->user->instID[0];
                        uStack_264 = local_268;
                        uStack_260 = local_268;
                        uStack_25c = local_268;
                        local_258 = context->user->instPrimID[0];
                        uStack_254 = local_258;
                        uStack_250 = local_258;
                        uStack_24c = local_258;
                        *(float *)(ray + k * 4 + 0x80) = fVar146;
                        local_578 = *local_418;
                        uStack_570 = local_418[1];
                        _local_558 = (int *)&local_578;
                        uStack_550 = pGVar7->userPtr;
                        local_548 = context->user;
                        local_540 = ray;
                        local_538 = (RTCIntersectArguments *)local_2d8;
                        local_530 = 4;
                        p_Var57 = pGVar7->intersectionFilterN;
                        if (p_Var57 != (RTCFilterFunctionN)0x0) {
                          p_Var57 = (RTCFilterFunctionN)
                                    (*p_Var57)((RTCFilterFunctionNArguments *)local_558);
                        }
                        auVar108._0_4_ = -(uint)((int)local_578 == 0);
                        auVar108._4_4_ = -(uint)(local_578._4_4_ == 0);
                        auVar108._8_4_ = -(uint)((int)uStack_570 == 0);
                        auVar108._12_4_ = -(uint)(uStack_570._4_4_ == 0);
                        uVar67 = movmskps((int)p_Var57,auVar108);
                        if ((uVar67 ^ 0xf) == 0) {
                          auVar108 = auVar108 ^ _DAT_01febe20;
                          pRVar59 = (RayHitK<4> *)(ulong)(uVar67 ^ 0xf);
                        }
                        else {
                          pRVar62 = context->args;
                          pRVar58 = (RTCIntersectArguments *)pRVar62->filter;
                          if ((pRVar58 != (RTCIntersectArguments *)0x0) &&
                             ((((ulong)*(Scene **)&pRVar62->flags & 2) != 0 ||
                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                            pRVar58 = (RTCIntersectArguments *)(*(code *)pRVar58)(local_558);
                          }
                          auVar138._0_4_ = -(uint)((int)local_578 == 0);
                          auVar138._4_4_ = -(uint)(local_578._4_4_ == 0);
                          auVar138._8_4_ = -(uint)((int)uStack_570 == 0);
                          auVar138._12_4_ = -(uint)(uStack_570._4_4_ == 0);
                          auVar108 = auVar138 ^ _DAT_01febe20;
                          uVar67 = movmskps((int)pRVar58,auVar138);
                          pRVar59 = (RayHitK<4> *)(ulong)(uVar67 ^ 0xf);
                          if ((uVar67 ^ 0xf) != 0) {
                            RVar17 = local_538->feature_mask;
                            uVar67 = *(uint *)&local_538->context;
                            uVar68 = *(uint *)((long)&local_538->context + 4);
                            *(RTCRayQueryFlags *)(local_540 + 0xc0) =
                                 ~auVar138._0_4_ & local_538->flags |
                                 *(uint *)(local_540 + 0xc0) & auVar138._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0xc4) =
                                 ~auVar138._4_4_ & RVar17 |
                                 *(RTCFeatureFlags *)(local_540 + 0xc4) & auVar138._4_4_;
                            *(uint *)(local_540 + 200) =
                                 ~auVar138._8_4_ & uVar67 |
                                 *(uint *)(local_540 + 200) & auVar138._8_4_;
                            *(uint *)(local_540 + 0xcc) =
                                 ~auVar138._12_4_ & uVar68 |
                                 *(uint *)(local_540 + 0xcc) & auVar138._12_4_;
                            RVar17 = *(RTCFeatureFlags *)((long)&local_538->filter + 4);
                            uVar67 = *(uint *)&local_538->intersect;
                            uVar68 = *(uint *)((long)&local_538->intersect + 4);
                            *(uint *)(local_540 + 0xd0) =
                                 ~auVar138._0_4_ & *(uint *)&local_538->filter |
                                 *(uint *)(local_540 + 0xd0) & auVar138._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0xd4) =
                                 ~auVar138._4_4_ & RVar17 |
                                 *(RTCFeatureFlags *)(local_540 + 0xd4) & auVar138._4_4_;
                            *(uint *)(local_540 + 0xd8) =
                                 ~auVar138._8_4_ & uVar67 |
                                 *(uint *)(local_540 + 0xd8) & auVar138._8_4_;
                            *(uint *)(local_540 + 0xdc) =
                                 ~auVar138._12_4_ & uVar68 |
                                 *(uint *)(local_540 + 0xdc) & auVar138._12_4_;
                            RVar17 = local_538[1].feature_mask;
                            uVar67 = *(uint *)&local_538[1].context;
                            uVar68 = *(uint *)((long)&local_538[1].context + 4);
                            *(RTCRayQueryFlags *)(local_540 + 0xe0) =
                                 ~auVar138._0_4_ & local_538[1].flags |
                                 *(uint *)(local_540 + 0xe0) & auVar138._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0xe4) =
                                 ~auVar138._4_4_ & RVar17 |
                                 *(RTCFeatureFlags *)(local_540 + 0xe4) & auVar138._4_4_;
                            *(uint *)(local_540 + 0xe8) =
                                 ~auVar138._8_4_ & uVar67 |
                                 *(uint *)(local_540 + 0xe8) & auVar138._8_4_;
                            *(uint *)(local_540 + 0xec) =
                                 ~auVar138._12_4_ & uVar68 |
                                 *(uint *)(local_540 + 0xec) & auVar138._12_4_;
                            RVar17 = *(RTCFeatureFlags *)((long)&local_538[1].filter + 4);
                            uVar67 = *(uint *)&local_538[1].intersect;
                            uVar68 = *(uint *)((long)&local_538[1].intersect + 4);
                            *(uint *)(local_540 + 0xf0) =
                                 ~auVar138._0_4_ & *(uint *)&local_538[1].filter |
                                 *(uint *)(local_540 + 0xf0) & auVar138._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0xf4) =
                                 ~auVar138._4_4_ & RVar17 |
                                 *(RTCFeatureFlags *)(local_540 + 0xf4) & auVar138._4_4_;
                            *(uint *)(local_540 + 0xf8) =
                                 ~auVar138._8_4_ & uVar67 |
                                 *(uint *)(local_540 + 0xf8) & auVar138._8_4_;
                            *(uint *)(local_540 + 0xfc) =
                                 ~auVar138._12_4_ & uVar68 |
                                 *(uint *)(local_540 + 0xfc) & auVar138._12_4_;
                            RVar17 = local_538[2].feature_mask;
                            uVar67 = *(uint *)&local_538[2].context;
                            uVar68 = *(uint *)((long)&local_538[2].context + 4);
                            *(RTCRayQueryFlags *)(local_540 + 0x100) =
                                 ~auVar138._0_4_ & local_538[2].flags |
                                 *(uint *)(local_540 + 0x100) & auVar138._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0x104) =
                                 ~auVar138._4_4_ & RVar17 |
                                 *(RTCFeatureFlags *)(local_540 + 0x104) & auVar138._4_4_;
                            *(uint *)(local_540 + 0x108) =
                                 ~auVar138._8_4_ & uVar67 |
                                 *(uint *)(local_540 + 0x108) & auVar138._8_4_;
                            *(uint *)(local_540 + 0x10c) =
                                 ~auVar138._12_4_ & uVar68 |
                                 *(uint *)(local_540 + 0x10c) & auVar138._12_4_;
                            RVar17 = *(RTCFeatureFlags *)((long)&local_538[2].filter + 4);
                            uVar67 = *(uint *)&local_538[2].intersect;
                            uVar68 = *(uint *)((long)&local_538[2].intersect + 4);
                            *(uint *)(local_540 + 0x110) =
                                 *(uint *)(local_540 + 0x110) & auVar138._0_4_ |
                                 ~auVar138._0_4_ & *(uint *)&local_538[2].filter;
                            *(RTCFeatureFlags *)(local_540 + 0x114) =
                                 *(RTCFeatureFlags *)(local_540 + 0x114) & auVar138._4_4_ |
                                 ~auVar138._4_4_ & RVar17;
                            *(uint *)(local_540 + 0x118) =
                                 *(uint *)(local_540 + 0x118) & auVar138._8_4_ |
                                 ~auVar138._8_4_ & uVar67;
                            *(uint *)(local_540 + 0x11c) =
                                 *(uint *)(local_540 + 0x11c) & auVar138._12_4_ |
                                 ~auVar138._12_4_ & uVar68;
                            RVar17 = local_538[3].feature_mask;
                            uVar67 = *(uint *)&local_538[3].context;
                            uVar68 = *(uint *)((long)&local_538[3].context + 4);
                            *(RTCRayQueryFlags *)(local_540 + 0x120) =
                                 *(uint *)(local_540 + 0x120) & auVar138._0_4_ |
                                 ~auVar138._0_4_ & local_538[3].flags;
                            *(RTCFeatureFlags *)(local_540 + 0x124) =
                                 *(RTCFeatureFlags *)(local_540 + 0x124) & auVar138._4_4_ |
                                 ~auVar138._4_4_ & RVar17;
                            *(uint *)(local_540 + 0x128) =
                                 *(uint *)(local_540 + 0x128) & auVar138._8_4_ |
                                 ~auVar138._8_4_ & uVar67;
                            *(uint *)(local_540 + 300) =
                                 *(uint *)(local_540 + 300) & auVar138._12_4_ |
                                 ~auVar138._12_4_ & uVar68;
                            RVar17 = *(RTCFeatureFlags *)((long)&local_538[3].filter + 4);
                            uVar67 = *(uint *)&local_538[3].intersect;
                            uVar68 = *(uint *)((long)&local_538[3].intersect + 4);
                            *(uint *)(local_540 + 0x130) =
                                 ~auVar138._0_4_ & *(uint *)&local_538[3].filter |
                                 *(uint *)(local_540 + 0x130) & auVar138._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0x134) =
                                 ~auVar138._4_4_ & RVar17 |
                                 *(RTCFeatureFlags *)(local_540 + 0x134) & auVar138._4_4_;
                            *(uint *)(local_540 + 0x138) =
                                 ~auVar138._8_4_ & uVar67 |
                                 *(uint *)(local_540 + 0x138) & auVar138._8_4_;
                            *(uint *)(local_540 + 0x13c) =
                                 ~auVar138._12_4_ & uVar68 |
                                 *(uint *)(local_540 + 0x13c) & auVar138._12_4_;
                            RVar17 = local_538[4].feature_mask;
                            uVar67 = *(uint *)&local_538[4].context;
                            uVar68 = *(uint *)((long)&local_538[4].context + 4);
                            *(RTCRayQueryFlags *)(local_540 + 0x140) =
                                 ~auVar138._0_4_ & local_538[4].flags |
                                 *(uint *)(local_540 + 0x140) & auVar138._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0x144) =
                                 ~auVar138._4_4_ & RVar17 |
                                 *(RTCFeatureFlags *)(local_540 + 0x144) & auVar138._4_4_;
                            *(uint *)(local_540 + 0x148) =
                                 ~auVar138._8_4_ & uVar67 |
                                 *(uint *)(local_540 + 0x148) & auVar138._8_4_;
                            *(uint *)(local_540 + 0x14c) =
                                 ~auVar138._12_4_ & uVar68 |
                                 *(uint *)(local_540 + 0x14c) & auVar138._12_4_;
                            pRVar59 = local_540;
                            pRVar62 = local_538;
                          }
                        }
                        auVar109._0_4_ = auVar108._0_4_ << 0x1f;
                        auVar109._4_4_ = auVar108._4_4_ << 0x1f;
                        auVar109._8_4_ = auVar108._8_4_ << 0x1f;
                        auVar109._12_4_ = auVar108._12_4_ << 0x1f;
                        iVar52 = movmskps((int)pRVar59,auVar109);
                        uVar55 = CONCAT44((int)((ulong)pRVar59 >> 0x20),iVar52);
                        if (iVar52 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar147;
                        }
                      }
                    }
                  }
                }
                bVar65 = lVar54 == 0;
                lVar54 = lVar54 + -1;
                uVar56 = CONCAT71((int7)(uVar55 >> 8),bVar65);
              } while ((!bVar9) && (!bVar65));
              fVar73 = *(float *)(ray + k * 4 + 0x80);
              local_3c8._0_4_ = -(uint)(local_488 <= fVar73) & local_3c8._0_4_;
              local_3c8._4_4_ = -(uint)(fStack_484 <= fVar73) & local_3c8._4_4_;
              local_3c8._8_4_ = -(uint)(fStack_480 <= fVar73) & local_3c8._8_4_;
              local_3c8._12_4_ = -(uint)(fStack_47c <= fVar73) & local_3c8._12_4_;
              uVar61 = (undefined4)(uVar55 >> 0x20);
              iVar52 = movmskps((int)uVar56,local_3c8);
            } while (iVar52 != 0);
          }
          auVar83 = _local_248;
          fVar73 = *(float *)(ray + k * 4 + 0x80);
          local_4c8._0_4_ = -(uint)((float)local_4c8._0_4_ + local_478 <= fVar73) & local_398._0_4_;
          local_4c8._4_4_ = -(uint)((float)local_4c8._4_4_ + fStack_474 <= fVar73) & local_398._4_4_
          ;
          fStack_4c0 = (float)(-(uint)(fStack_4c0 + fStack_470 <= fVar73) & (uint)fStack_390);
          fStack_4bc = (float)(-(uint)(fStack_4bc + fStack_46c <= fVar73) & (uint)fStack_38c);
          local_4b8._0_4_ =
               -(uint)((int)local_3b8 <
                      ((int)((local_4b8._0_4_ & local_4d8._0_4_) << 0x1f) >> 0x1f) + 4);
          local_4b8._4_4_ =
               -(uint)((int)fStack_3b4 <
                      ((int)((local_4b8._4_4_ & local_4d8._4_4_) << 0x1f) >> 0x1f) + 4);
          fStack_4b0 = (float)-(uint)((int)fStack_3b0 <
                                     ((int)(((uint)fStack_4b0 & (uint)fStack_4d0) << 0x1f) >> 0x1f)
                                     + 4);
          fStack_4ac = (float)-(uint)((int)fStack_3ac <
                                     ((int)(((uint)fStack_4ac & (uint)fStack_4cc) << 0x1f) >> 0x1f)
                                     + 4);
          local_3d8 = ~_local_4b8 & _local_4c8;
          iVar52 = movmskps(iVar52,local_3d8);
          if (iVar52 != 0) {
            local_488 = local_478 + (float)local_248._0_4_;
            fStack_484 = fStack_474 + (float)local_248._4_4_;
            fStack_480 = fStack_470 + fStack_240;
            fStack_47c = fStack_46c + fStack_23c;
            do {
              auVar194 = ~local_3d8 & _DAT_01feb9f0 | local_3d8 & auVar83;
              auVar170._4_4_ = auVar194._0_4_;
              auVar170._0_4_ = auVar194._4_4_;
              auVar170._8_4_ = auVar194._12_4_;
              auVar170._12_4_ = auVar194._8_4_;
              auVar193 = minps(auVar170,auVar194);
              auVar139._0_8_ = auVar193._8_8_;
              auVar139._8_4_ = auVar193._0_4_;
              auVar139._12_4_ = auVar193._4_4_;
              auVar193 = minps(auVar139,auVar193);
              auVar140._0_8_ =
                   CONCAT44(-(uint)(auVar193._4_4_ == auVar194._4_4_) & local_3d8._4_4_,
                            -(uint)(auVar193._0_4_ == auVar194._0_4_) & local_3d8._0_4_);
              auVar140._8_4_ = -(uint)(auVar193._8_4_ == auVar194._8_4_) & local_3d8._8_4_;
              auVar140._12_4_ = -(uint)(auVar193._12_4_ == auVar194._12_4_) & local_3d8._12_4_;
              iVar52 = movmskps(iVar52,auVar140);
              auVar110 = local_3d8;
              if (iVar52 != 0) {
                auVar110._8_4_ = auVar140._8_4_;
                auVar110._0_8_ = auVar140._0_8_;
                auVar110._12_4_ = auVar140._12_4_;
              }
              uVar53 = movmskps(iVar52,auVar110);
              uVar56 = 0;
              if (CONCAT44(uVar61,uVar53) != 0) {
                for (; (CONCAT44(uVar61,uVar53) >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
                }
              }
              *(undefined4 *)(local_3d8 + uVar56 * 4) = 0;
              fVar73 = local_378[uVar56];
              fVar146 = *(float *)(local_238 + uVar56 * 4);
              fVar147 = SQRT(fVar122);
              if ((float)local_3f8._0_4_ < 0.0) {
                fVar147 = sqrtf((float)local_3f8._0_4_);
                uVar56 = extraout_RAX_03;
              }
              auVar20._4_4_ = fVar119;
              auVar20._0_4_ = fVar118;
              auVar20._8_4_ = fVar120;
              auVar20._12_4_ = fVar121;
              auVar26._4_4_ = fStack_4e4;
              auVar26._0_4_ = local_4e8;
              auVar26._8_4_ = fStack_4e0;
              auVar26._12_4_ = fStack_4dc;
              auVar194 = minps(auVar20,auVar26);
              auVar231 = maxps(auVar20,auVar26);
              auVar24._4_4_ = fStack_4f4;
              auVar24._0_4_ = local_4f8;
              auVar24._8_4_ = fStack_4f0;
              auVar24._12_4_ = fStack_4ec;
              auVar22._4_4_ = fStack_504;
              auVar22._0_4_ = local_508;
              auVar22._8_4_ = fStack_500;
              auVar22._12_4_ = fStack_4fc;
              auVar193 = minps(auVar24,auVar22);
              auVar194 = minps(auVar194,auVar193);
              auVar193 = maxps(auVar24,auVar22);
              auVar193 = maxps(auVar231,auVar193);
              auVar185._0_8_ = auVar194._0_8_ & 0x7fffffff7fffffff;
              auVar185._8_4_ = auVar194._8_4_ & 0x7fffffff;
              auVar185._12_4_ = auVar194._12_4_ & 0x7fffffff;
              local_468 = auVar193._12_4_;
              auVar111._0_8_ = auVar193._0_8_ & 0x7fffffff7fffffff;
              auVar111._8_4_ = auVar193._8_4_ & 0x7fffffff;
              auVar111._12_4_ = ABS(local_468);
              auVar193 = maxps(auVar185,auVar111);
              fVar148 = auVar193._4_4_;
              if (auVar193._4_4_ <= auVar193._0_4_) {
                fVar148 = auVar193._0_4_;
              }
              auVar186._8_8_ = auVar193._8_8_;
              auVar186._0_8_ = auVar193._8_8_;
              if (auVar193._8_4_ <= fVar148) {
                auVar186._0_4_ = fVar148;
              }
              fVar148 = auVar186._0_4_ * 1.9073486e-06;
              local_438 = fVar147 * 1.9073486e-06;
              fStack_464 = local_468;
              fStack_460 = local_468;
              fStack_45c = local_468;
              lVar54 = 4;
              do {
                fVar212 = 1.0 - fVar73;
                fVar175 = local_4e8 * fVar212 + local_4f8 * fVar73;
                fVar190 = fStack_4e4 * fVar212 + fStack_4f4 * fVar73;
                fVar200 = fStack_4e0 * fVar212 + fStack_4f0 * fVar73;
                fVar202 = fStack_4dc * fVar212 + fStack_4ec * fVar73;
                fVar147 = (fVar118 * fVar212 + local_4e8 * fVar73) * fVar212 + fVar73 * fVar175;
                fVar161 = (fVar119 * fVar212 + fStack_4e4 * fVar73) * fVar212 + fVar73 * fVar190;
                fVar163 = (fVar120 * fVar212 + fStack_4e0 * fVar73) * fVar212 + fVar73 * fVar200;
                fVar174 = (fVar121 * fVar212 + fStack_4dc * fVar73) * fVar212 + fVar73 * fVar202;
                fVar175 = fVar175 * fVar212 + (local_4f8 * fVar212 + local_508 * fVar73) * fVar73;
                fVar201 = fVar190 * fVar212 + (fStack_4f4 * fVar212 + fStack_504 * fVar73) * fVar73;
                fVar176 = fVar200 * fVar212 + (fStack_4f0 * fVar212 + fStack_500 * fVar73) * fVar73;
                fVar189 = fVar202 * fVar212 + (fStack_4ec * fVar212 + fStack_4fc * fVar73) * fVar73;
                fVar190 = fVar212 * fVar174 + fVar73 * fVar189;
                fVar200 = (fVar175 - fVar147) * 3.0;
                fVar202 = (fVar201 - fVar161) * 3.0;
                fVar188 = (fVar176 - fVar163) * 3.0;
                fVar189 = (fVar189 - fVar174) * 3.0;
                fVar174 = (fVar146 * (float)local_3e8._0_4_ + 0.0) -
                          (fVar212 * fVar147 + fVar73 * fVar175);
                fVar161 = (fVar146 * (float)local_3e8._4_4_ + 0.0) -
                          (fVar212 * fVar161 + fVar73 * fVar201);
                fVar163 = (fVar146 * fStack_3e0 + 0.0) - (fVar212 * fVar163 + fVar73 * fVar176);
                fVar175 = (fVar146 * fStack_3dc + 0.0) - fVar190;
                fVar147 = fVar161 * fVar161;
                fStack_630 = fVar163 * fVar163;
                fStack_62c = fVar175 * fVar175;
                local_638._0_4_ = fVar147 + fVar174 * fVar174 + fStack_630;
                local_638._4_4_ = fVar147 + fVar147 + fStack_62c;
                fStack_630 = fVar147 + fStack_630 + fStack_630;
                fStack_62c = fVar147 + fStack_62c + fStack_62c;
                local_518 = (float)local_638._0_4_;
                if ((float)local_638._0_4_ < 0.0) {
                  fVar147 = sqrtf((float)local_638._0_4_);
                  uVar55 = extraout_RAX_04;
                }
                else {
                  fVar147 = SQRT((float)local_638._0_4_);
                  uVar55 = uVar56;
                }
                fVar213 = fVar212 * 6.0;
                fVar201 = (fVar73 - (fVar212 + fVar212)) * 6.0;
                fVar212 = (fVar212 - (fVar73 + fVar73)) * 6.0;
                fVar176 = fVar73 * 6.0;
                fVar214 = fVar213 * fVar118 +
                          fVar201 * local_4e8 + fVar212 * local_4f8 + fVar176 * local_508;
                fVar234 = fVar213 * fVar119 +
                          fVar201 * fStack_4e4 + fVar212 * fStack_4f4 + fVar176 * fStack_504;
                fVar176 = fVar213 * fVar120 +
                          fVar201 * fStack_4e0 + fVar212 * fStack_4f0 + fVar176 * fStack_500;
                fVar201 = fVar148;
                if (fVar148 <= local_438 * fVar146) {
                  fVar201 = local_438 * fVar146;
                }
                fVar212 = fVar202 * fVar202 + fVar200 * fVar200 + fVar188 * fVar188;
                auVar194 = ZEXT416((uint)fVar212);
                auVar193 = rsqrtss(ZEXT416((uint)fVar212),auVar194);
                fVar213 = auVar193._0_4_;
                fVar213 = fVar213 * fVar213 * fVar212 * -0.5 * fVar213 + fVar213 * 1.5;
                fVar235 = fVar188 * fVar176 + fVar202 * fVar234 + fVar200 * fVar214;
                auVar193 = rcpss(auVar194,auVar194);
                fVar236 = (2.0 - fVar212 * auVar193._0_4_) * auVar193._0_4_;
                fVar244 = fVar200 * fVar213;
                fVar245 = fVar202 * fVar213;
                fVar246 = fVar188 * fVar213;
                fVar257 = fVar189 * fVar213;
                local_5f8._0_4_ = -fVar200;
                local_5f8._4_4_ = -fVar202;
                if (fVar212 < 0.0) {
                  local_5f8 = CONCAT44(fVar202,fVar200) ^ 0x8000000080000000;
                  fVar258 = sqrtf(fVar212);
                  uVar55 = extraout_RAX_05;
                }
                else {
                  fVar258 = SQRT(fVar212);
                }
                fVar259 = fVar161 * fVar245;
                fVar262 = fVar163 * fVar246;
                fVar264 = fVar175 * fVar257;
                fVar267 = fVar259 + fVar174 * fVar244 + fVar262;
                fVar273 = fVar259 + fVar259 + fVar264;
                fVar262 = fVar259 + fVar262 + fVar262;
                fVar264 = fVar259 + fVar264 + fVar264;
                fVar259 = (fVar147 + 1.0) * (fVar148 / fVar258) + fVar147 * fVar148 + fVar201;
                fVar258 = fStack_3dc * fVar257;
                fVar213 = fVar246 * -fVar188 +
                          fVar245 * local_5f8._4_4_ + fVar244 * (float)local_5f8 +
                          fVar236 * (fVar212 * fVar176 - fVar235 * fVar188) * fVar213 * fVar163 +
                          fVar236 * (fVar212 * fVar234 - fVar235 * fVar202) * fVar213 * fVar161 +
                          fVar236 * (fVar212 * fVar214 - fVar235 * fVar200) * fVar213 * fVar174;
                fVar176 = fStack_3e0 * fVar246 +
                          (float)local_3e8._4_4_ * fVar245 + (float)local_3e8._0_4_ * fVar244;
                fVar147 = (float)local_638._0_4_ - fVar267 * fVar267;
                auVar112._0_8_ = CONCAT44((float)local_638._4_4_ - fVar273 * fVar273,fVar147);
                auVar112._8_4_ = fStack_630 - fVar262 * fVar262;
                auVar112._12_4_ = fStack_62c - fVar264 * fVar264;
                fVar212 = -fVar189 * fVar175;
                local_428 = (fStack_3e0 * fVar163 +
                            (float)local_3e8._4_4_ * fVar161 + (float)local_3e8._0_4_ * fVar174) -
                            fVar267 * fVar176;
                fStack_424 = fStack_3dc * fVar175;
                fStack_420 = fStack_3e0 * fVar163;
                fStack_41c = fStack_3dc * fVar175;
                auVar171._8_4_ = auVar112._8_4_;
                auVar171._0_8_ = auVar112._0_8_;
                auVar171._12_4_ = auVar112._12_4_;
                auVar193 = rsqrtss(auVar171,auVar112);
                fVar175 = auVar193._0_4_;
                auVar172._4_12_ = auVar193._4_12_;
                auVar172._0_4_ = fVar175 * fVar175 * fVar147 * -0.5 * fVar175 + fVar175 * 1.5;
                if (fVar147 < 0.0) {
                  _local_458 = auVar172;
                  local_448 = fVar267;
                  fStack_444 = fVar273;
                  fStack_440 = fVar262;
                  fStack_43c = fVar264;
                  fVar147 = sqrtf(fVar147);
                  uVar55 = extraout_RAX_06;
                  auVar172 = _local_458;
                  fVar175 = local_448;
                }
                else {
                  fVar147 = SQRT(fVar147);
                  fVar175 = fVar267;
                }
                fVar147 = fVar147 - fVar190;
                fVar190 = ((-fVar188 * fVar163 +
                           local_5f8._4_4_ * fVar161 + (float)local_5f8 * fVar174) -
                          fVar267 * fVar213) * auVar172._0_4_ - fVar189;
                auVar29._4_4_ = fStack_424;
                auVar29._0_4_ = local_428;
                auVar29._8_4_ = fStack_420;
                auVar29._12_4_ = fStack_41c;
                auVar156._4_12_ = auVar29._4_12_;
                auVar156._0_4_ = local_428 * auVar172._0_4_;
                auVar255._0_8_ = CONCAT44(fVar212,fVar190) ^ 0x8000000080000000;
                auVar255._8_4_ = -fVar212;
                auVar255._12_4_ = fVar257 * -fVar189;
                auVar254._8_8_ = auVar255._8_8_;
                auVar254._0_8_ = CONCAT44(fVar213,fVar190) ^ 0x80000000;
                fVar190 = fVar213 * auVar156._0_4_ - fVar176 * fVar190;
                auVar158._0_8_ = auVar156._0_8_;
                auVar158._8_4_ = fStack_424;
                auVar158._12_4_ = -fVar258;
                auVar157._8_8_ = auVar158._8_8_;
                auVar157._0_8_ = CONCAT44(fVar176,auVar156._0_4_) ^ 0x8000000000000000;
                auVar14._4_4_ = fVar190;
                auVar14._0_4_ = fVar190;
                auVar14._8_4_ = fVar190;
                auVar14._12_4_ = fVar190;
                auVar193 = divps(auVar157,auVar14);
                auVar15._4_4_ = fVar190;
                auVar15._0_4_ = fVar190;
                auVar15._8_4_ = fVar190;
                auVar15._12_4_ = fVar190;
                auVar194 = divps(auVar254,auVar15);
                fVar73 = fVar73 - (auVar193._4_4_ * fVar147 + auVar193._0_4_ * fVar175);
                fVar146 = fVar146 - (auVar194._4_4_ * fVar147 + auVar194._0_4_ * fVar175);
                if (fVar259 <= ABS(fVar175)) {
                  bVar9 = false;
                }
                else if (local_468 * 1.9073486e-06 + fVar201 + fVar259 <= ABS(fVar147)) {
                  bVar9 = false;
                }
                else {
                  fVar146 = fVar146 + (float)local_388._0_4_;
                  bVar9 = true;
                  if ((((fVar162 <= fVar146) &&
                       (fVar147 = *(float *)(ray + k * 4 + 0x80), fVar146 <= fVar147)) &&
                      (0.0 <= fVar73)) && (fVar73 <= 1.0)) {
                    auVar193 = rsqrtss(_local_638,_local_638);
                    fVar175 = auVar193._0_4_;
                    pGVar7 = (context->scene->geometries).items[uVar63].ptr;
                    uVar55 = (ulong)*(uint *)(ray + k * 4 + 0x90);
                    pRVar62 = (RTCIntersectArguments *)context;
                    if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar175 = fVar175 * 1.5 + fVar175 * fVar175 * local_518 * -0.5 * fVar175;
                      fVar174 = fVar174 * fVar175;
                      fVar161 = fVar161 * fVar175;
                      fVar163 = fVar163 * fVar175;
                      fVar175 = fVar189 * fVar174 + fVar200;
                      fVar190 = fVar189 * fVar161 + fVar202;
                      fVar201 = fVar189 * fVar163 + fVar188;
                      fVar176 = fVar161 * fVar200 - fVar202 * fVar174;
                      fVar202 = fVar163 * fVar202 - fVar188 * fVar161;
                      fVar163 = fVar174 * fVar188 - fVar200 * fVar163;
                      fVar161 = fVar190 * fVar202 - fVar163 * fVar175;
                      fVar163 = fVar201 * fVar163 - fVar176 * fVar190;
                      fVar174 = fVar175 * fVar176 - fVar202 * fVar201;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar146;
                        *(float *)(ray + k * 4 + 0xc0) = fVar163;
                        *(float *)(ray + k * 4 + 0xd0) = fVar174;
                        *(float *)(ray + k * 4 + 0xe0) = fVar161;
                        *(float *)(ray + k * 4 + 0xf0) = fVar73;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(undefined4 *)(ray + k * 4 + 0x110) = uVar6;
                        *(uint *)(ray + k * 4 + 0x120) = uVar66;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        uVar67 = context->user->instPrimID[0];
                        uVar55 = (ulong)uVar67;
                        *(uint *)(ray + k * 4 + 0x140) = uVar67;
                      }
                      else {
                        local_2d8._4_4_ = fVar163;
                        local_2d8._0_4_ = fVar163;
                        local_2d8._8_4_ = fVar163;
                        fStack_2cc = fVar163;
                        local_2c8 = fVar174;
                        fStack_2c4 = fVar174;
                        fStack_2c0 = fVar174;
                        fStack_2bc = fVar174;
                        local_2b8 = fVar161;
                        fStack_2b4 = fVar161;
                        fStack_2b0 = fVar161;
                        fStack_2ac = fVar161;
                        local_2a8 = fVar73;
                        fStack_2a4 = fVar73;
                        fStack_2a0 = fVar73;
                        fStack_29c = fVar73;
                        local_298 = 0;
                        uStack_290 = 0;
                        local_288 = CONCAT44(uStack_344,local_348);
                        uStack_280 = CONCAT44(uStack_33c,uStack_340);
                        local_278 = CONCAT44(uStack_334,local_338);
                        uStack_270 = CONCAT44(uStack_32c,uStack_330);
                        local_268 = context->user->instID[0];
                        uStack_264 = local_268;
                        uStack_260 = local_268;
                        uStack_25c = local_268;
                        local_258 = context->user->instPrimID[0];
                        uStack_254 = local_258;
                        uStack_250 = local_258;
                        uStack_24c = local_258;
                        *(float *)(ray + k * 4 + 0x80) = fVar146;
                        local_578 = *local_418;
                        uStack_570 = local_418[1];
                        _local_558 = (int *)&local_578;
                        uStack_550 = pGVar7->userPtr;
                        local_548 = context->user;
                        local_540 = ray;
                        local_538 = (RTCIntersectArguments *)local_2d8;
                        local_530 = 4;
                        p_Var57 = pGVar7->intersectionFilterN;
                        if (p_Var57 != (RTCFilterFunctionN)0x0) {
                          p_Var57 = (RTCFilterFunctionN)
                                    (*p_Var57)((RTCFilterFunctionNArguments *)local_558);
                        }
                        auVar113._0_4_ = -(uint)((int)local_578 == 0);
                        auVar113._4_4_ = -(uint)(local_578._4_4_ == 0);
                        auVar113._8_4_ = -(uint)((int)uStack_570 == 0);
                        auVar113._12_4_ = -(uint)(uStack_570._4_4_ == 0);
                        uVar67 = movmskps((int)p_Var57,auVar113);
                        if ((uVar67 ^ 0xf) == 0) {
                          auVar113 = auVar113 ^ _DAT_01febe20;
                          pRVar59 = (RayHitK<4> *)(ulong)(uVar67 ^ 0xf);
                        }
                        else {
                          pRVar62 = context->args;
                          pRVar58 = (RTCIntersectArguments *)pRVar62->filter;
                          if ((pRVar58 != (RTCIntersectArguments *)0x0) &&
                             ((((ulong)*(Scene **)&pRVar62->flags & 2) != 0 ||
                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                            pRVar58 = (RTCIntersectArguments *)(*(code *)pRVar58)(local_558);
                          }
                          auVar141._0_4_ = -(uint)((int)local_578 == 0);
                          auVar141._4_4_ = -(uint)(local_578._4_4_ == 0);
                          auVar141._8_4_ = -(uint)((int)uStack_570 == 0);
                          auVar141._12_4_ = -(uint)(uStack_570._4_4_ == 0);
                          auVar113 = auVar141 ^ _DAT_01febe20;
                          uVar67 = movmskps((int)pRVar58,auVar141);
                          pRVar59 = (RayHitK<4> *)(ulong)(uVar67 ^ 0xf);
                          if ((uVar67 ^ 0xf) != 0) {
                            RVar17 = local_538->feature_mask;
                            uVar67 = *(uint *)&local_538->context;
                            uVar68 = *(uint *)((long)&local_538->context + 4);
                            *(RTCRayQueryFlags *)(local_540 + 0xc0) =
                                 ~auVar141._0_4_ & local_538->flags |
                                 *(uint *)(local_540 + 0xc0) & auVar141._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0xc4) =
                                 ~auVar141._4_4_ & RVar17 |
                                 *(RTCFeatureFlags *)(local_540 + 0xc4) & auVar141._4_4_;
                            *(uint *)(local_540 + 200) =
                                 ~auVar141._8_4_ & uVar67 |
                                 *(uint *)(local_540 + 200) & auVar141._8_4_;
                            *(uint *)(local_540 + 0xcc) =
                                 ~auVar141._12_4_ & uVar68 |
                                 *(uint *)(local_540 + 0xcc) & auVar141._12_4_;
                            RVar17 = *(RTCFeatureFlags *)((long)&local_538->filter + 4);
                            uVar67 = *(uint *)&local_538->intersect;
                            uVar68 = *(uint *)((long)&local_538->intersect + 4);
                            *(uint *)(local_540 + 0xd0) =
                                 ~auVar141._0_4_ & *(uint *)&local_538->filter |
                                 *(uint *)(local_540 + 0xd0) & auVar141._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0xd4) =
                                 ~auVar141._4_4_ & RVar17 |
                                 *(RTCFeatureFlags *)(local_540 + 0xd4) & auVar141._4_4_;
                            *(uint *)(local_540 + 0xd8) =
                                 ~auVar141._8_4_ & uVar67 |
                                 *(uint *)(local_540 + 0xd8) & auVar141._8_4_;
                            *(uint *)(local_540 + 0xdc) =
                                 ~auVar141._12_4_ & uVar68 |
                                 *(uint *)(local_540 + 0xdc) & auVar141._12_4_;
                            RVar17 = local_538[1].feature_mask;
                            uVar67 = *(uint *)&local_538[1].context;
                            uVar68 = *(uint *)((long)&local_538[1].context + 4);
                            *(RTCRayQueryFlags *)(local_540 + 0xe0) =
                                 ~auVar141._0_4_ & local_538[1].flags |
                                 *(uint *)(local_540 + 0xe0) & auVar141._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0xe4) =
                                 ~auVar141._4_4_ & RVar17 |
                                 *(RTCFeatureFlags *)(local_540 + 0xe4) & auVar141._4_4_;
                            *(uint *)(local_540 + 0xe8) =
                                 ~auVar141._8_4_ & uVar67 |
                                 *(uint *)(local_540 + 0xe8) & auVar141._8_4_;
                            *(uint *)(local_540 + 0xec) =
                                 ~auVar141._12_4_ & uVar68 |
                                 *(uint *)(local_540 + 0xec) & auVar141._12_4_;
                            RVar17 = *(RTCFeatureFlags *)((long)&local_538[1].filter + 4);
                            uVar67 = *(uint *)&local_538[1].intersect;
                            uVar68 = *(uint *)((long)&local_538[1].intersect + 4);
                            *(uint *)(local_540 + 0xf0) =
                                 ~auVar141._0_4_ & *(uint *)&local_538[1].filter |
                                 *(uint *)(local_540 + 0xf0) & auVar141._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0xf4) =
                                 ~auVar141._4_4_ & RVar17 |
                                 *(RTCFeatureFlags *)(local_540 + 0xf4) & auVar141._4_4_;
                            *(uint *)(local_540 + 0xf8) =
                                 ~auVar141._8_4_ & uVar67 |
                                 *(uint *)(local_540 + 0xf8) & auVar141._8_4_;
                            *(uint *)(local_540 + 0xfc) =
                                 ~auVar141._12_4_ & uVar68 |
                                 *(uint *)(local_540 + 0xfc) & auVar141._12_4_;
                            RVar17 = local_538[2].feature_mask;
                            uVar67 = *(uint *)&local_538[2].context;
                            uVar68 = *(uint *)((long)&local_538[2].context + 4);
                            *(RTCRayQueryFlags *)(local_540 + 0x100) =
                                 ~auVar141._0_4_ & local_538[2].flags |
                                 *(uint *)(local_540 + 0x100) & auVar141._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0x104) =
                                 ~auVar141._4_4_ & RVar17 |
                                 *(RTCFeatureFlags *)(local_540 + 0x104) & auVar141._4_4_;
                            *(uint *)(local_540 + 0x108) =
                                 ~auVar141._8_4_ & uVar67 |
                                 *(uint *)(local_540 + 0x108) & auVar141._8_4_;
                            *(uint *)(local_540 + 0x10c) =
                                 ~auVar141._12_4_ & uVar68 |
                                 *(uint *)(local_540 + 0x10c) & auVar141._12_4_;
                            RVar17 = *(RTCFeatureFlags *)((long)&local_538[2].filter + 4);
                            uVar67 = *(uint *)&local_538[2].intersect;
                            uVar68 = *(uint *)((long)&local_538[2].intersect + 4);
                            *(uint *)(local_540 + 0x110) =
                                 *(uint *)(local_540 + 0x110) & auVar141._0_4_ |
                                 ~auVar141._0_4_ & *(uint *)&local_538[2].filter;
                            *(RTCFeatureFlags *)(local_540 + 0x114) =
                                 *(RTCFeatureFlags *)(local_540 + 0x114) & auVar141._4_4_ |
                                 ~auVar141._4_4_ & RVar17;
                            *(uint *)(local_540 + 0x118) =
                                 *(uint *)(local_540 + 0x118) & auVar141._8_4_ |
                                 ~auVar141._8_4_ & uVar67;
                            *(uint *)(local_540 + 0x11c) =
                                 *(uint *)(local_540 + 0x11c) & auVar141._12_4_ |
                                 ~auVar141._12_4_ & uVar68;
                            RVar17 = local_538[3].feature_mask;
                            uVar67 = *(uint *)&local_538[3].context;
                            uVar68 = *(uint *)((long)&local_538[3].context + 4);
                            *(RTCRayQueryFlags *)(local_540 + 0x120) =
                                 *(uint *)(local_540 + 0x120) & auVar141._0_4_ |
                                 ~auVar141._0_4_ & local_538[3].flags;
                            *(RTCFeatureFlags *)(local_540 + 0x124) =
                                 *(RTCFeatureFlags *)(local_540 + 0x124) & auVar141._4_4_ |
                                 ~auVar141._4_4_ & RVar17;
                            *(uint *)(local_540 + 0x128) =
                                 *(uint *)(local_540 + 0x128) & auVar141._8_4_ |
                                 ~auVar141._8_4_ & uVar67;
                            *(uint *)(local_540 + 300) =
                                 *(uint *)(local_540 + 300) & auVar141._12_4_ |
                                 ~auVar141._12_4_ & uVar68;
                            RVar17 = *(RTCFeatureFlags *)((long)&local_538[3].filter + 4);
                            uVar67 = *(uint *)&local_538[3].intersect;
                            uVar68 = *(uint *)((long)&local_538[3].intersect + 4);
                            *(uint *)(local_540 + 0x130) =
                                 ~auVar141._0_4_ & *(uint *)&local_538[3].filter |
                                 *(uint *)(local_540 + 0x130) & auVar141._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0x134) =
                                 ~auVar141._4_4_ & RVar17 |
                                 *(RTCFeatureFlags *)(local_540 + 0x134) & auVar141._4_4_;
                            *(uint *)(local_540 + 0x138) =
                                 ~auVar141._8_4_ & uVar67 |
                                 *(uint *)(local_540 + 0x138) & auVar141._8_4_;
                            *(uint *)(local_540 + 0x13c) =
                                 ~auVar141._12_4_ & uVar68 |
                                 *(uint *)(local_540 + 0x13c) & auVar141._12_4_;
                            RVar17 = local_538[4].feature_mask;
                            uVar67 = *(uint *)&local_538[4].context;
                            uVar68 = *(uint *)((long)&local_538[4].context + 4);
                            *(RTCRayQueryFlags *)(local_540 + 0x140) =
                                 ~auVar141._0_4_ & local_538[4].flags |
                                 *(uint *)(local_540 + 0x140) & auVar141._0_4_;
                            *(RTCFeatureFlags *)(local_540 + 0x144) =
                                 ~auVar141._4_4_ & RVar17 |
                                 *(RTCFeatureFlags *)(local_540 + 0x144) & auVar141._4_4_;
                            *(uint *)(local_540 + 0x148) =
                                 ~auVar141._8_4_ & uVar67 |
                                 *(uint *)(local_540 + 0x148) & auVar141._8_4_;
                            *(uint *)(local_540 + 0x14c) =
                                 ~auVar141._12_4_ & uVar68 |
                                 *(uint *)(local_540 + 0x14c) & auVar141._12_4_;
                            pRVar59 = local_540;
                            pRVar62 = local_538;
                          }
                        }
                        auVar114._0_4_ = auVar113._0_4_ << 0x1f;
                        auVar114._4_4_ = auVar113._4_4_ << 0x1f;
                        auVar114._8_4_ = auVar113._8_4_ << 0x1f;
                        auVar114._12_4_ = auVar113._12_4_ << 0x1f;
                        iVar52 = movmskps((int)pRVar59,auVar114);
                        uVar55 = CONCAT44((int)((ulong)pRVar59 >> 0x20),iVar52);
                        if (iVar52 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar147;
                        }
                      }
                    }
                  }
                }
                bVar65 = lVar54 == 0;
                lVar54 = lVar54 + -1;
                uVar56 = CONCAT71((int7)(uVar55 >> 8),bVar65);
              } while ((!bVar9) && (!bVar65));
              fVar73 = *(float *)(ray + k * 4 + 0x80);
              local_3d8._0_4_ = -(uint)(local_488 <= fVar73) & local_3d8._0_4_;
              local_3d8._4_4_ = -(uint)(fStack_484 <= fVar73) & local_3d8._4_4_;
              local_3d8._8_4_ = -(uint)(fStack_480 <= fVar73) & local_3d8._8_4_;
              local_3d8._12_4_ = -(uint)(fStack_47c <= fVar73) & local_3d8._12_4_;
              uVar61 = (undefined4)(uVar55 >> 0x20);
              iVar52 = movmskps((int)uVar56,local_3d8);
            } while (iVar52 != 0);
          }
          fVar73 = *(float *)(ray + k * 4 + 0x80);
          auVar187._0_4_ =
               local_528._0_4_ & local_3a8._0_4_ &
               -(uint)(local_478 + (float)local_118._0_4_ <= fVar73);
          auVar187._4_4_ =
               local_528._4_4_ & local_3a8._4_4_ &
               -(uint)(fStack_474 + (float)local_118._4_4_ <= fVar73);
          auVar187._8_4_ =
               (uint)fStack_520 & (uint)fStack_3a0 & -(uint)(fStack_470 + fStack_110 <= fVar73);
          auVar187._12_4_ =
               (uint)fStack_51c & (uint)fStack_39c & -(uint)(fStack_46c + fStack_10c <= fVar73);
          auVar159._0_4_ =
               local_4b8._0_4_ & local_4c8._0_4_ &
               -(uint)(local_478 + (float)local_248._0_4_ <= fVar73);
          auVar159._4_4_ =
               local_4b8._4_4_ & local_4c8._4_4_ &
               -(uint)(fStack_474 + (float)local_248._4_4_ <= fVar73);
          auVar159._8_4_ =
               (uint)fStack_4b0 & (uint)fStack_4c0 & -(uint)(fStack_470 + fStack_240 <= fVar73);
          auVar159._12_4_ =
               (uint)fStack_4ac & (uint)fStack_4bc & -(uint)(fStack_46c + fStack_23c <= fVar73);
          iVar52 = movmskps(iVar52,auVar159 | auVar187);
          if (iVar52 != 0) {
            *(undefined1 (*) [16])(auStack_f8 + uVar60 * 0xc) = auVar159 | auVar187;
            afStack_e8[uVar60 * 0xc] =
                 (float)(~auVar187._0_4_ & local_248._0_4_ | local_118._0_4_ & auVar187._0_4_);
            afStack_e8[uVar60 * 0xc + 1] =
                 (float)(~auVar187._4_4_ & local_248._4_4_ | local_118._4_4_ & auVar187._4_4_);
            afStack_e8[uVar60 * 0xc + 2] =
                 (float)(~auVar187._8_4_ & (uint)fStack_240 | (uint)fStack_110 & auVar187._8_4_);
            afStack_e8[uVar60 * 0xc + 3] =
                 (float)(~auVar187._12_4_ & (uint)fStack_23c | (uint)fStack_10c & auVar187._12_4_);
            afStack_d0[uVar60 * 0xc + -2] = local_4a8;
            afStack_d0[uVar60 * 0xc + -1] = fStack_4a4;
            fVar73 = (float)((int)local_560 + 1);
            pRVar62 = (RTCIntersectArguments *)(ulong)(uint)fVar73;
            afStack_d0[uVar60 * 0xc] = fVar73;
            uVar60 = (ulong)((int)uVar60 + 1);
          }
        }
      }
    }
    do {
      uVar67 = (uint)uVar60;
      if (uVar67 == 0) {
        fVar162 = *(float *)(ray + k * 4 + 0x80);
        auVar145._4_4_ = -(uint)(fStack_224 <= fVar162);
        auVar145._0_4_ = -(uint)(local_228 <= fVar162);
        auVar145._8_4_ = -(uint)(fStack_220 <= fVar162);
        auVar145._12_4_ = -(uint)(fStack_21c <= fVar162);
        uVar66 = movmskps(0,auVar145);
        uVar66 = (uint)local_350 & uVar66;
        if (uVar66 == 0) {
          return;
        }
        goto LAB_00afe112;
      }
      uVar60 = (ulong)(uVar67 - 1);
      fVar73 = *(float *)(ray + k * 4 + 0x80);
      auVar115._0_4_ =
           -(uint)(local_478 + afStack_e8[uVar60 * 0xc] <= fVar73) & auStack_f8[uVar60 * 0xc];
      auVar115._4_4_ =
           -(uint)(fStack_474 + afStack_e8[uVar60 * 0xc + 1] <= fVar73) &
           auStack_f8[uVar60 * 0xc + 1];
      auVar115._8_4_ =
           -(uint)(fStack_470 + afStack_e8[uVar60 * 0xc + 2] <= fVar73) &
           auStack_f8[uVar60 * 0xc + 2];
      auVar115._12_4_ =
           -(uint)(fStack_46c + afStack_e8[uVar60 * 0xc + 3] <= fVar73) &
           (uint)afStack_e8[uVar60 * 0xc + -1];
      _local_2d8 = auVar115;
      uVar68 = movmskps((int)pRVar62,auVar115);
      pRVar62 = (RTCIntersectArguments *)(ulong)uVar68;
      if (uVar68 != 0) {
        auVar142._0_4_ = (uint)afStack_e8[uVar60 * 0xc] & auVar115._0_4_;
        auVar142._4_4_ = (uint)afStack_e8[uVar60 * 0xc + 1] & auVar115._4_4_;
        auVar142._8_4_ = (uint)afStack_e8[uVar60 * 0xc + 2] & auVar115._8_4_;
        auVar142._12_4_ = (uint)afStack_e8[uVar60 * 0xc + 3] & auVar115._12_4_;
        auVar160._0_8_ = CONCAT44(~auVar115._4_4_,~auVar115._0_4_) & 0x7f8000007f800000;
        auVar160._8_4_ = ~auVar115._8_4_ & 0x7f800000;
        auVar160._12_4_ = ~auVar115._12_4_ & 0x7f800000;
        auVar160 = auVar160 | auVar142;
        auVar173._4_4_ = auVar160._0_4_;
        auVar173._0_4_ = auVar160._4_4_;
        auVar173._8_4_ = auVar160._12_4_;
        auVar173._12_4_ = auVar160._8_4_;
        auVar83 = minps(auVar173,auVar160);
        auVar143._0_8_ = auVar83._8_8_;
        auVar143._8_4_ = auVar83._0_4_;
        auVar143._12_4_ = auVar83._4_4_;
        auVar83 = minps(auVar143,auVar83);
        auVar144._0_8_ =
             CONCAT44(-(uint)(auVar83._4_4_ == auVar160._4_4_) & auVar115._4_4_,
                      -(uint)(auVar83._0_4_ == auVar160._0_4_) & auVar115._0_4_);
        auVar144._8_4_ = -(uint)(auVar83._8_4_ == auVar160._8_4_) & auVar115._8_4_;
        auVar144._12_4_ = -(uint)(auVar83._12_4_ == auVar160._12_4_) & auVar115._12_4_;
        iVar52 = movmskps((int)uVar64,auVar144);
        if (iVar52 != 0) {
          auVar115._8_4_ = auVar144._8_4_;
          auVar115._0_8_ = auVar144._0_8_;
          auVar115._12_4_ = auVar144._12_4_;
        }
        fVar73 = afStack_d0[uVar60 * 0xc + -2];
        fVar146 = afStack_d0[uVar60 * 0xc + -1];
        local_560 = (ulong)(uint)afStack_d0[uVar60 * 0xc];
        uVar69 = movmskps(afStack_d0[uVar60 * 0xc],auVar115);
        uVar64 = 0;
        if (uVar69 != 0) {
          for (; (uVar69 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
          }
        }
        *(undefined4 *)(local_2d8 + uVar64 * 4) = 0;
        *(undefined1 (*) [16])(auStack_f8 + uVar60 * 0xc) = _local_2d8;
        iVar52 = movmskps((int)(undefined1 (*) [16])(auStack_f8 + uVar60 * 0xc),_local_2d8);
        if (iVar52 == 0) {
          uVar67 = uVar67 - 1;
        }
        fVar146 = fVar146 - fVar73;
        _local_558 = (int *)CONCAT44(fVar146 * 0.33333334 + fVar73,fVar146 * 0.0 + fVar73);
        uStack_550 = (void *)CONCAT44(fVar146 * 1.0 + fVar73,fVar146 * 0.6666667 + fVar73);
        local_4a8 = *(float *)(local_558 + uVar64 * 4);
        fStack_4a4 = *(float *)(local_558 + uVar64 * 4 + 4);
        uStack_4a0 = 0;
        uStack_49c = 0;
        uVar60 = (ulong)uVar67;
      }
      uVar56 = uVar60;
    } while ((char)uVar68 == '\0');
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }